

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Primitive PVar13;
  uint uVar14;
  undefined4 uVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  int iVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined1 auVar75 [32];
  byte bVar76;
  ulong uVar77;
  uint uVar78;
  uint uVar79;
  int iVar80;
  ulong uVar81;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  uint uVar82;
  ulong uVar83;
  long lVar84;
  Geometry *pGVar85;
  byte bVar86;
  ulong uVar87;
  float fVar88;
  float fVar89;
  float fVar140;
  float fVar141;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar97 [16];
  float fVar142;
  float fVar144;
  float fVar145;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar143;
  float fVar146;
  float fVar147;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar148;
  undefined4 uVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar161;
  float fVar162;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar165;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar171;
  float fVar172;
  float fVar186;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [64];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [16];
  undefined1 auVar207 [64];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  RTCFilterFunctionNArguments args;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  RTCFilterFunctionNArguments local_5a0;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  ulong local_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  int local_3f0;
  int iStack_3ec;
  int iStack_3e8;
  int iStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined4 local_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_390 [16];
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  int local_1fc;
  undefined1 local_1f0 [16];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar218 [64];
  
  PVar13 = prim[1];
  uVar81 = (ulong)(byte)PVar13;
  fVar165 = *(float *)(prim + uVar81 * 0x19 + 0x12);
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar152 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar93 = vsubps_avx(auVar95,*(undefined1 (*) [16])(prim + uVar81 * 0x19 + 6));
  fVar171 = fVar165 * auVar93._0_4_;
  fVar148 = fVar165 * auVar152._0_4_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar81 * 4 + 6);
  auVar103 = vpmovsxbd_avx2(auVar95);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar81 * 5 + 6);
  auVar101 = vpmovsxbd_avx2(auVar96);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar81 * 6 + 6);
  auVar114 = vpmovsxbd_avx2(auVar150);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar81 * 0xb + 6);
  auVar113 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar13 * 0xc) + 6);
  auVar107 = vpmovsxbd_avx2(auVar9);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar104 = vcvtdq2ps_avx(auVar107);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (uint)(byte)PVar13 * 0xc + uVar81 + 6);
  auVar102 = vpmovsxbd_avx2(auVar10);
  auVar102 = vcvtdq2ps_avx(auVar102);
  uVar83 = (ulong)(uint)((int)(uVar81 * 9) * 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar83 + 6);
  auVar105 = vpmovsxbd_avx2(auVar11);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar83 + uVar81 + 6);
  auVar112 = vpmovsxbd_avx2(auVar12);
  auVar112 = vcvtdq2ps_avx(auVar112);
  uVar77 = (ulong)(uint)((int)(uVar81 * 5) << 2);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar77 + 6);
  auVar100 = vpmovsxbd_avx2(auVar94);
  auVar106 = vcvtdq2ps_avx(auVar100);
  auVar211._4_4_ = fVar148;
  auVar211._0_4_ = fVar148;
  auVar211._8_4_ = fVar148;
  auVar211._12_4_ = fVar148;
  auVar211._16_4_ = fVar148;
  auVar211._20_4_ = fVar148;
  auVar211._24_4_ = fVar148;
  auVar211._28_4_ = fVar148;
  auVar213._8_4_ = 1;
  auVar213._0_8_ = 0x100000001;
  auVar213._12_4_ = 1;
  auVar213._16_4_ = 1;
  auVar213._20_4_ = 1;
  auVar213._24_4_ = 1;
  auVar213._28_4_ = 1;
  auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar109 = ZEXT1632(CONCAT412(fVar165 * auVar152._12_4_,
                                CONCAT48(fVar165 * auVar152._8_4_,
                                         CONCAT44(fVar165 * auVar152._4_4_,fVar148))));
  auVar108 = vpermps_avx2(auVar213,auVar109);
  auVar99 = vpermps_avx512vl(auVar98,auVar109);
  fVar148 = auVar99._0_4_;
  fVar161 = auVar99._4_4_;
  auVar109._4_4_ = fVar161 * auVar114._4_4_;
  auVar109._0_4_ = fVar148 * auVar114._0_4_;
  fVar162 = auVar99._8_4_;
  auVar109._8_4_ = fVar162 * auVar114._8_4_;
  fVar172 = auVar99._12_4_;
  auVar109._12_4_ = fVar172 * auVar114._12_4_;
  fVar186 = auVar99._16_4_;
  auVar109._16_4_ = fVar186 * auVar114._16_4_;
  fVar88 = auVar99._20_4_;
  auVar109._20_4_ = fVar88 * auVar114._20_4_;
  fVar89 = auVar99._24_4_;
  auVar109._24_4_ = fVar89 * auVar114._24_4_;
  auVar109._28_4_ = auVar107._28_4_;
  auVar107._4_4_ = auVar102._4_4_ * fVar161;
  auVar107._0_4_ = auVar102._0_4_ * fVar148;
  auVar107._8_4_ = auVar102._8_4_ * fVar162;
  auVar107._12_4_ = auVar102._12_4_ * fVar172;
  auVar107._16_4_ = auVar102._16_4_ * fVar186;
  auVar107._20_4_ = auVar102._20_4_ * fVar88;
  auVar107._24_4_ = auVar102._24_4_ * fVar89;
  auVar107._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar106._4_4_ * fVar161;
  auVar100._0_4_ = auVar106._0_4_ * fVar148;
  auVar100._8_4_ = auVar106._8_4_ * fVar162;
  auVar100._12_4_ = auVar106._12_4_ * fVar172;
  auVar100._16_4_ = auVar106._16_4_ * fVar186;
  auVar100._20_4_ = auVar106._20_4_ * fVar88;
  auVar100._24_4_ = auVar106._24_4_ * fVar89;
  auVar100._28_4_ = auVar99._28_4_;
  auVar95 = vfmadd231ps_fma(auVar109,auVar108,auVar101);
  auVar96 = vfmadd231ps_fma(auVar107,auVar108,auVar104);
  auVar150 = vfmadd231ps_fma(auVar100,auVar112,auVar108);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar211,auVar103);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar211,auVar113);
  auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar105,auVar211);
  auVar212._4_4_ = fVar171;
  auVar212._0_4_ = fVar171;
  auVar212._8_4_ = fVar171;
  auVar212._12_4_ = fVar171;
  auVar212._16_4_ = fVar171;
  auVar212._20_4_ = fVar171;
  auVar212._24_4_ = fVar171;
  auVar212._28_4_ = fVar171;
  auVar100 = ZEXT1632(CONCAT412(fVar165 * auVar93._12_4_,
                                CONCAT48(fVar165 * auVar93._8_4_,
                                         CONCAT44(fVar165 * auVar93._4_4_,fVar171))));
  auVar107 = vpermps_avx2(auVar213,auVar100);
  auVar100 = vpermps_avx512vl(auVar98,auVar100);
  fVar165 = auVar100._0_4_;
  fVar148 = auVar100._4_4_;
  auVar108._4_4_ = fVar148 * auVar114._4_4_;
  auVar108._0_4_ = fVar165 * auVar114._0_4_;
  fVar161 = auVar100._8_4_;
  auVar108._8_4_ = fVar161 * auVar114._8_4_;
  fVar162 = auVar100._12_4_;
  auVar108._12_4_ = fVar162 * auVar114._12_4_;
  fVar172 = auVar100._16_4_;
  auVar108._16_4_ = fVar172 * auVar114._16_4_;
  fVar186 = auVar100._20_4_;
  auVar108._20_4_ = fVar186 * auVar114._20_4_;
  fVar88 = auVar100._24_4_;
  auVar108._24_4_ = fVar88 * auVar114._24_4_;
  auVar108._28_4_ = 1;
  auVar98._4_4_ = auVar102._4_4_ * fVar148;
  auVar98._0_4_ = auVar102._0_4_ * fVar165;
  auVar98._8_4_ = auVar102._8_4_ * fVar161;
  auVar98._12_4_ = auVar102._12_4_ * fVar162;
  auVar98._16_4_ = auVar102._16_4_ * fVar172;
  auVar98._20_4_ = auVar102._20_4_ * fVar186;
  auVar98._24_4_ = auVar102._24_4_ * fVar88;
  auVar98._28_4_ = auVar114._28_4_;
  auVar102._4_4_ = auVar106._4_4_ * fVar148;
  auVar102._0_4_ = auVar106._0_4_ * fVar165;
  auVar102._8_4_ = auVar106._8_4_ * fVar161;
  auVar102._12_4_ = auVar106._12_4_ * fVar162;
  auVar102._16_4_ = auVar106._16_4_ * fVar172;
  auVar102._20_4_ = auVar106._20_4_ * fVar186;
  auVar102._24_4_ = auVar106._24_4_ * fVar88;
  auVar102._28_4_ = auVar100._28_4_;
  auVar8 = vfmadd231ps_fma(auVar108,auVar107,auVar101);
  auVar9 = vfmadd231ps_fma(auVar98,auVar107,auVar104);
  auVar10 = vfmadd231ps_fma(auVar102,auVar107,auVar112);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar212,auVar103);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar212,auVar113);
  auVar200._8_4_ = 0x7fffffff;
  auVar200._0_8_ = 0x7fffffff7fffffff;
  auVar200._12_4_ = 0x7fffffff;
  auVar200._16_4_ = 0x7fffffff;
  auVar200._20_4_ = 0x7fffffff;
  auVar200._24_4_ = 0x7fffffff;
  auVar200._28_4_ = 0x7fffffff;
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar212,auVar105);
  auVar103 = vandps_avx(ZEXT1632(auVar95),auVar200);
  auVar198._8_4_ = 0x219392ef;
  auVar198._0_8_ = 0x219392ef219392ef;
  auVar198._12_4_ = 0x219392ef;
  auVar198._16_4_ = 0x219392ef;
  auVar198._20_4_ = 0x219392ef;
  auVar198._24_4_ = 0x219392ef;
  auVar198._28_4_ = 0x219392ef;
  uVar83 = vcmpps_avx512vl(auVar103,auVar198,1);
  bVar17 = (bool)((byte)uVar83 & 1);
  auVar99._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar95._0_4_;
  bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar95._4_4_;
  bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar95._8_4_;
  bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar95._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar83 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(ZEXT1632(auVar96),auVar200);
  uVar83 = vcmpps_avx512vl(auVar103,auVar198,1);
  bVar17 = (bool)((byte)uVar83 & 1);
  auVar110._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar96._0_4_;
  bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar110._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar96._4_4_;
  bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar110._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar96._8_4_;
  bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar110._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar96._12_4_;
  auVar110._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * 0x219392ef;
  auVar110._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * 0x219392ef;
  auVar110._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * 0x219392ef;
  auVar110._28_4_ = (uint)(byte)(uVar83 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(ZEXT1632(auVar150),auVar200);
  uVar83 = vcmpps_avx512vl(auVar103,auVar198,1);
  bVar17 = (bool)((byte)uVar83 & 1);
  auVar103._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar150._0_4_;
  bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar150._4_4_;
  bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar150._8_4_;
  bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar150._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar83 >> 7) * 0x219392ef;
  auVar101 = vrcp14ps_avx512vl(auVar99);
  auVar199._8_4_ = 0x3f800000;
  auVar199._0_8_ = 0x3f8000003f800000;
  auVar199._12_4_ = 0x3f800000;
  auVar199._16_4_ = 0x3f800000;
  auVar199._20_4_ = 0x3f800000;
  auVar199._24_4_ = 0x3f800000;
  auVar199._28_4_ = 0x3f800000;
  auVar95 = vfnmadd213ps_fma(auVar99,auVar101,auVar199);
  auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar101,auVar101);
  auVar101 = vrcp14ps_avx512vl(auVar110);
  auVar96 = vfnmadd213ps_fma(auVar110,auVar101,auVar199);
  auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar101,auVar101);
  auVar101 = vrcp14ps_avx512vl(auVar103);
  auVar150 = vfnmadd213ps_fma(auVar103,auVar101,auVar199);
  auVar150 = vfmadd132ps_fma(ZEXT1632(auVar150),auVar101,auVar101);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 7 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar8));
  auVar105._4_4_ = auVar95._4_4_ * auVar103._4_4_;
  auVar105._0_4_ = auVar95._0_4_ * auVar103._0_4_;
  auVar105._8_4_ = auVar95._8_4_ * auVar103._8_4_;
  auVar105._12_4_ = auVar95._12_4_ * auVar103._12_4_;
  auVar105._16_4_ = auVar103._16_4_ * 0.0;
  auVar105._20_4_ = auVar103._20_4_ * 0.0;
  auVar105._24_4_ = auVar103._24_4_ * 0.0;
  auVar105._28_4_ = auVar103._28_4_;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 9 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar8));
  auVar102 = vpbroadcastd_avx512vl();
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar13 * 0x10 + 6));
  auVar168._0_4_ = auVar95._0_4_ * auVar103._0_4_;
  auVar168._4_4_ = auVar95._4_4_ * auVar103._4_4_;
  auVar168._8_4_ = auVar95._8_4_ * auVar103._8_4_;
  auVar168._12_4_ = auVar95._12_4_ * auVar103._12_4_;
  auVar168._16_4_ = auVar103._16_4_ * 0.0;
  auVar168._20_4_ = auVar103._20_4_ * 0.0;
  auVar168._24_4_ = auVar103._24_4_ * 0.0;
  auVar168._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar13 * 0x10 + uVar81 * -2 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar9));
  auVar112._4_4_ = auVar96._4_4_ * auVar103._4_4_;
  auVar112._0_4_ = auVar96._0_4_ * auVar103._0_4_;
  auVar112._8_4_ = auVar96._8_4_ * auVar103._8_4_;
  auVar112._12_4_ = auVar96._12_4_ * auVar103._12_4_;
  auVar112._16_4_ = auVar103._16_4_ * 0.0;
  auVar112._20_4_ = auVar103._20_4_ * 0.0;
  auVar112._24_4_ = auVar103._24_4_ * 0.0;
  auVar112._28_4_ = auVar103._28_4_;
  auVar103 = vcvtdq2ps_avx(auVar101);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar9));
  auVar163._0_4_ = auVar96._0_4_ * auVar103._0_4_;
  auVar163._4_4_ = auVar96._4_4_ * auVar103._4_4_;
  auVar163._8_4_ = auVar96._8_4_ * auVar103._8_4_;
  auVar163._12_4_ = auVar96._12_4_ * auVar103._12_4_;
  auVar163._16_4_ = auVar103._16_4_ * 0.0;
  auVar163._20_4_ = auVar103._20_4_ * 0.0;
  auVar163._24_4_ = auVar103._24_4_ * 0.0;
  auVar163._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 + uVar81 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar10));
  auVar106._4_4_ = auVar103._4_4_ * auVar150._4_4_;
  auVar106._0_4_ = auVar103._0_4_ * auVar150._0_4_;
  auVar106._8_4_ = auVar103._8_4_ * auVar150._8_4_;
  auVar106._12_4_ = auVar103._12_4_ * auVar150._12_4_;
  auVar106._16_4_ = auVar103._16_4_ * 0.0;
  auVar106._20_4_ = auVar103._20_4_ * 0.0;
  auVar106._24_4_ = auVar103._24_4_ * 0.0;
  auVar106._28_4_ = auVar103._28_4_;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 0x17 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar10));
  auVar111._0_4_ = auVar150._0_4_ * auVar103._0_4_;
  auVar111._4_4_ = auVar150._4_4_ * auVar103._4_4_;
  auVar111._8_4_ = auVar150._8_4_ * auVar103._8_4_;
  auVar111._12_4_ = auVar150._12_4_ * auVar103._12_4_;
  auVar111._16_4_ = auVar103._16_4_ * 0.0;
  auVar111._20_4_ = auVar103._20_4_ * 0.0;
  auVar111._24_4_ = auVar103._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar103 = vpminsd_avx2(auVar105,auVar168);
  auVar101 = vpminsd_avx2(auVar112,auVar163);
  auVar103 = vmaxps_avx(auVar103,auVar101);
  auVar101 = vpminsd_avx2(auVar106,auVar111);
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar114._4_4_ = uVar149;
  auVar114._0_4_ = uVar149;
  auVar114._8_4_ = uVar149;
  auVar114._12_4_ = uVar149;
  auVar114._16_4_ = uVar149;
  auVar114._20_4_ = uVar149;
  auVar114._24_4_ = uVar149;
  auVar114._28_4_ = uVar149;
  auVar101 = vmaxps_avx512vl(auVar101,auVar114);
  auVar103 = vmaxps_avx(auVar103,auVar101);
  auVar101._8_4_ = 0x3f7ffffa;
  auVar101._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar101._12_4_ = 0x3f7ffffa;
  auVar101._16_4_ = 0x3f7ffffa;
  auVar101._20_4_ = 0x3f7ffffa;
  auVar101._24_4_ = 0x3f7ffffa;
  auVar101._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar103,auVar101);
  auVar103 = vpmaxsd_avx2(auVar105,auVar168);
  auVar101 = vpmaxsd_avx2(auVar112,auVar163);
  auVar103 = vminps_avx(auVar103,auVar101);
  auVar101 = vpmaxsd_avx2(auVar106,auVar111);
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar113._4_4_ = uVar149;
  auVar113._0_4_ = uVar149;
  auVar113._8_4_ = uVar149;
  auVar113._12_4_ = uVar149;
  auVar113._16_4_ = uVar149;
  auVar113._20_4_ = uVar149;
  auVar113._24_4_ = uVar149;
  auVar113._28_4_ = uVar149;
  auVar101 = vminps_avx512vl(auVar101,auVar113);
  auVar103 = vminps_avx(auVar103,auVar101);
  auVar104._8_4_ = 0x3f800003;
  auVar104._0_8_ = 0x3f8000033f800003;
  auVar104._12_4_ = 0x3f800003;
  auVar104._16_4_ = 0x3f800003;
  auVar104._20_4_ = 0x3f800003;
  auVar104._24_4_ = 0x3f800003;
  auVar104._28_4_ = 0x3f800003;
  auVar103 = vmulps_avx512vl(auVar103,auVar104);
  uVar26 = vpcmpgtd_avx512vl(auVar102,_DAT_01fe9900);
  uVar23 = vcmpps_avx512vl(local_80,auVar103,2);
  if ((byte)((byte)uVar23 & (byte)uVar26) != 0) {
    uVar83 = (ulong)(byte)((byte)uVar23 & (byte)uVar26);
    local_4f0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      lVar27 = 0;
      for (uVar77 = uVar83; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar82 = *(uint *)(prim + 2);
      uVar14 = *(uint *)(prim + lVar27 * 4 + 6);
      pGVar85 = (context->scene->geometries).items[uVar82].ptr;
      uVar77 = (ulong)*(uint *)(*(long *)&pGVar85->field_0x58 +
                               pGVar85[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar14);
      p_Var16 = pGVar85[1].intersectionFilterN;
      lVar27 = *(long *)&pGVar85[1].time_range.upper;
      local_5b0 = *(undefined1 (*) [16])(lVar27 + (long)p_Var16 * uVar77);
      pauVar3 = (undefined1 (*) [16])(lVar27 + (uVar77 + 1) * (long)p_Var16);
      uVar23 = *(undefined8 *)*pauVar3;
      uVar26 = *(undefined8 *)(*pauVar3 + 8);
      auVar12 = *pauVar3;
      auVar10 = *pauVar3;
      auVar8 = *pauVar3;
      auVar95 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar27 + (uVar77 + 2) * (long)p_Var16);
      uVar71 = *(undefined8 *)*pauVar4;
      uVar72 = *(undefined8 *)(*pauVar4 + 8);
      auVar11 = *pauVar4;
      auVar9 = *pauVar4;
      auVar150 = *pauVar4;
      auVar96 = *pauVar4;
      uVar83 = uVar83 - 1 & uVar83;
      pauVar5 = (undefined1 (*) [12])(lVar27 + (uVar77 + 3) * (long)p_Var16);
      uVar73 = *(undefined8 *)*pauVar5;
      uVar74 = *(undefined8 *)(*pauVar5 + 8);
      local_5f0 = (float)uVar73;
      fStack_5ec = (float)((ulong)uVar73 >> 0x20);
      fStack_5e8 = (float)uVar74;
      fStack_5e4 = (float)((ulong)uVar74 >> 0x20);
      if (uVar83 != 0) {
        uVar81 = uVar83 - 1 & uVar83;
        for (uVar77 = uVar83; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
        }
        if (uVar81 != 0) {
          for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar80 = (int)pGVar85[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar93 = vsubps_avx(local_5b0,auVar94);
      uVar149 = auVar93._0_4_;
      auVar90._4_4_ = uVar149;
      auVar90._0_4_ = uVar149;
      auVar90._8_4_ = uVar149;
      auVar90._12_4_ = uVar149;
      auVar152 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      aVar6 = pre->ray_space[k].vx.field_0;
      aVar7 = pre->ray_space[k].vy.field_0;
      fVar165 = pre->ray_space[k].vz.field_0.m128[0];
      fVar148 = pre->ray_space[k].vz.field_0.m128[1];
      fVar161 = pre->ray_space[k].vz.field_0.m128[2];
      fVar162 = pre->ray_space[k].vz.field_0.m128[3];
      auVar202._0_4_ = fVar165 * auVar93._0_4_;
      auVar202._4_4_ = fVar148 * auVar93._4_4_;
      auVar202._8_4_ = fVar161 * auVar93._8_4_;
      auVar202._12_4_ = fVar162 * auVar93._12_4_;
      auVar152 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar7,auVar152);
      auVar202 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar6,auVar90);
      auVar152 = vshufps_avx(local_5b0,local_5b0,0xff);
      auVar90 = vsubps_avx512vl(auVar95,auVar94);
      uVar149 = auVar90._0_4_;
      auVar173._4_4_ = uVar149;
      auVar173._0_4_ = uVar149;
      auVar173._8_4_ = uVar149;
      auVar173._12_4_ = uVar149;
      auVar93 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar91._0_4_ = fVar165 * auVar90._0_4_;
      auVar91._4_4_ = fVar148 * auVar90._4_4_;
      auVar91._8_4_ = fVar161 * auVar90._8_4_;
      auVar91._12_4_ = fVar162 * auVar90._12_4_;
      auVar93 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar7,auVar93);
      auVar173 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar6,auVar173);
      auVar91 = vshufps_avx512vl(auVar95,auVar95,0xff);
      auVar90 = vsubps_avx512vl(auVar96,auVar94);
      uVar149 = auVar90._0_4_;
      auVar92._4_4_ = uVar149;
      auVar92._0_4_ = uVar149;
      auVar92._8_4_ = uVar149;
      auVar92._12_4_ = uVar149;
      auVar93 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar206._0_4_ = fVar165 * auVar90._0_4_;
      auVar206._4_4_ = fVar148 * auVar90._4_4_;
      auVar206._8_4_ = fVar161 * auVar90._8_4_;
      auVar206._12_4_ = fVar162 * auVar90._12_4_;
      auVar93 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar7,auVar93);
      auVar90 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar6,auVar92);
      auVar92 = vshufps_avx512vl(auVar96,auVar96,0xff);
      auVar28._12_4_ = fStack_5e4;
      auVar28._0_12_ = *pauVar5;
      auVar93 = vsubps_avx512vl(auVar28,auVar94);
      uVar149 = auVar93._0_4_;
      auVar174._4_4_ = uVar149;
      auVar174._0_4_ = uVar149;
      auVar174._8_4_ = uVar149;
      auVar174._12_4_ = uVar149;
      auVar94 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar208._0_4_ = fVar165 * auVar93._0_4_;
      auVar208._4_4_ = fVar148 * auVar93._4_4_;
      auVar208._8_4_ = fVar161 * auVar93._8_4_;
      auVar208._12_4_ = fVar162 * auVar93._12_4_;
      auVar94 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar7,auVar94);
      auVar93 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar6,auVar174);
      lVar27 = (long)iVar80 * 0x44;
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27);
      auVar94 = vshufps_avx512vl(auVar28,auVar28,0xff);
      uVar149 = auVar202._0_4_;
      local_280._4_4_ = uVar149;
      local_280._0_4_ = uVar149;
      local_280._8_4_ = uVar149;
      local_280._12_4_ = uVar149;
      local_280._16_4_ = uVar149;
      local_280._20_4_ = uVar149;
      local_280._24_4_ = uVar149;
      local_280._28_4_ = uVar149;
      auVar187._8_4_ = 1;
      auVar187._0_8_ = 0x100000001;
      auVar187._12_4_ = 1;
      auVar187._16_4_ = 1;
      auVar187._20_4_ = 1;
      auVar187._24_4_ = 1;
      auVar187._28_4_ = 1;
      local_2a0 = vpermps_avx2(auVar187,ZEXT1632(auVar202));
      local_a0 = vbroadcastsd_avx512vl(auVar152);
      auVar101 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x484);
      uVar149 = auVar173._0_4_;
      auVar97._4_4_ = uVar149;
      auVar97._0_4_ = uVar149;
      auVar97._8_4_ = uVar149;
      auVar97._12_4_ = uVar149;
      local_2c0._16_4_ = uVar149;
      local_2c0._0_16_ = auVar97;
      local_2c0._20_4_ = uVar149;
      local_2c0._24_4_ = uVar149;
      local_2c0._28_4_ = uVar149;
      local_2e0 = vpermps_avx512vl(auVar187,ZEXT1632(auVar173));
      local_c0 = vbroadcastsd_avx512vl(auVar91);
      auVar114 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x908);
      uVar149 = auVar90._0_4_;
      local_300._4_4_ = uVar149;
      local_300._0_4_ = uVar149;
      local_300._8_4_ = uVar149;
      local_300._12_4_ = uVar149;
      local_300._16_4_ = uVar149;
      local_300._20_4_ = uVar149;
      local_300._24_4_ = uVar149;
      local_300._28_4_ = uVar149;
      local_320 = vpermps_avx512vl(auVar187,ZEXT1632(auVar90));
      local_e0 = vbroadcastsd_avx512vl(auVar92);
      auVar113 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0xd8c);
      fVar148 = auVar93._0_4_;
      local_340._4_4_ = fVar148;
      local_340._0_4_ = fVar148;
      fStack_338 = fVar148;
      fStack_334 = fVar148;
      fStack_330 = fVar148;
      fStack_32c = fVar148;
      fStack_328 = fVar148;
      register0x0000139c = fVar148;
      _local_360 = vpermps_avx512vl(auVar187,ZEXT1632(auVar93));
      local_100 = vbroadcastsd_avx512vl(auVar94);
      auVar104 = vmulps_avx512vl(_local_340,auVar113);
      auVar102 = vmulps_avx512vl(_local_360,auVar113);
      auVar94 = vfmadd231ps_fma(auVar104,auVar114,local_300);
      auVar104 = vfmadd231ps_avx512vl(auVar102,auVar114,local_320);
      auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar101,local_2c0);
      auVar105 = vfmadd231ps_avx512vl(auVar104,auVar101,local_2e0);
      auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar103,local_280);
      auVar197 = ZEXT3264(auVar106);
      auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27);
      auVar102 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x484);
      auVar107 = vfmadd231ps_avx512vl(auVar105,auVar103,local_2a0);
      auVar192 = ZEXT3264(auVar107);
      auVar105 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x908);
      auVar112 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0xd8c);
      auVar100 = vmulps_avx512vl(_local_340,auVar112);
      auVar108 = vmulps_avx512vl(_local_360,auVar112);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar105,local_300);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,local_320);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,local_2c0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar102,local_2e0);
      auVar152 = vfmadd231ps_fma(auVar100,auVar104,local_280);
      auVar201 = ZEXT1664(auVar152);
      auVar91 = vfmadd231ps_fma(auVar108,auVar104,local_2a0);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar152),auVar106);
      auVar108 = vsubps_avx512vl(ZEXT1632(auVar91),auVar107);
      auVar109 = vmulps_avx512vl(auVar107,auVar100);
      auVar98 = vmulps_avx512vl(auVar106,auVar108);
      auVar109 = vsubps_avx512vl(auVar109,auVar98);
      auVar98 = vmulps_avx512vl(local_100,auVar113);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar114,local_e0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,local_c0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,local_a0);
      auVar99 = vmulps_avx512vl(local_100,auVar112);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar105,local_e0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,local_c0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,local_a0);
      auVar110 = vmulps_avx512vl(auVar108,auVar108);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar100,auVar100);
      auVar111 = vmaxps_avx512vl(auVar98,auVar99);
      auVar111 = vmulps_avx512vl(auVar111,auVar111);
      auVar110 = vmulps_avx512vl(auVar111,auVar110);
      auVar109 = vmulps_avx512vl(auVar109,auVar109);
      uVar24 = vcmpps_avx512vl(auVar109,auVar110,2);
      auVar94 = vblendps_avx(auVar202,local_5b0,8);
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar94 = vandps_avx512vl(auVar94,auVar92);
      auVar95 = vblendps_avx(auVar173,auVar95,8);
      auVar95 = vandps_avx512vl(auVar95,auVar92);
      auVar94 = vmaxps_avx(auVar94,auVar95);
      auVar95 = vblendps_avx(auVar90,auVar96,8);
      auVar96 = vandps_avx512vl(auVar95,auVar92);
      auVar95 = vblendps_avx(auVar93,auVar28,8);
      auVar95 = vandps_avx512vl(auVar95,auVar92);
      auVar95 = vmaxps_avx(auVar96,auVar95);
      auVar95 = vmaxps_avx(auVar94,auVar95);
      auVar96 = vmovshdup_avx(auVar95);
      auVar96 = vmaxss_avx(auVar96,auVar95);
      auVar95 = vshufpd_avx(auVar95,auVar95,1);
      auVar95 = vmaxss_avx(auVar95,auVar96);
      local_570._0_4_ = (undefined4)iVar80;
      local_570._4_12_ = auVar202._4_12_;
      auVar210._4_4_ = local_570._0_4_;
      auVar210._0_4_ = local_570._0_4_;
      auVar210._8_4_ = local_570._0_4_;
      auVar210._12_4_ = local_570._0_4_;
      auVar210._16_4_ = local_570._0_4_;
      auVar210._20_4_ = local_570._0_4_;
      auVar210._24_4_ = local_570._0_4_;
      auVar210._28_4_ = local_570._0_4_;
      uVar25 = vcmpps_avx512vl(auVar210,_DAT_01faff40,0xe);
      bVar86 = (byte)uVar24 & (byte)uVar25;
      fVar165 = auVar95._0_4_ * 4.7683716e-07;
      local_520._0_16_ = ZEXT416((uint)fVar165);
      auVar182._8_4_ = 2;
      auVar182._0_8_ = 0x200000002;
      auVar182._12_4_ = 2;
      auVar182._16_4_ = 2;
      auVar182._20_4_ = 2;
      auVar182._24_4_ = 2;
      auVar182._28_4_ = 2;
      local_480 = vpermps_avx512vl(auVar182,ZEXT1632(auVar202));
      auVar219 = ZEXT3264(local_480);
      local_4a0 = vpermps_avx512vl(auVar182,ZEXT1632(auVar173));
      auVar221 = ZEXT3264(local_4a0);
      auVar109 = vpermps_avx512vl(auVar182,ZEXT1632(auVar90));
      local_140 = vpermps_avx2(auVar182,ZEXT1632(auVar93));
      local_420 = *(undefined4 *)(ray + k * 4 + 0x30);
      uStack_41c = 0;
      uStack_418 = 0;
      uStack_414 = 0;
      if (bVar86 != 0) {
        auVar112 = vmulps_avx512vl(local_140,auVar112);
        auVar105 = vfmadd213ps_avx512vl(auVar105,auVar109,auVar112);
        auVar102 = vfmadd213ps_avx512vl(auVar102,local_4a0,auVar105);
        auVar102 = vfmadd213ps_avx512vl(auVar104,local_480,auVar102);
        auVar113 = vmulps_avx512vl(local_140,auVar113);
        auVar114 = vfmadd213ps_avx512vl(auVar114,auVar109,auVar113);
        auVar105 = vfmadd213ps_avx512vl(auVar101,local_4a0,auVar114);
        auVar101 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1210);
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1694);
        auVar113 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1b18);
        auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1f9c);
        auVar105 = vfmadd213ps_avx512vl(auVar103,local_480,auVar105);
        auVar203._0_4_ = fVar148 * auVar104._0_4_;
        auVar203._4_4_ = fVar148 * auVar104._4_4_;
        auVar203._8_4_ = fVar148 * auVar104._8_4_;
        auVar203._12_4_ = fVar148 * auVar104._12_4_;
        auVar203._16_4_ = fVar148 * auVar104._16_4_;
        auVar203._20_4_ = fVar148 * auVar104._20_4_;
        auVar203._24_4_ = fVar148 * auVar104._24_4_;
        auVar203._28_4_ = 0;
        auVar103 = vmulps_avx512vl(_local_360,auVar104);
        auVar104 = vmulps_avx512vl(local_140,auVar104);
        auVar112 = vfmadd231ps_avx512vl(auVar203,auVar113,local_300);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar113,local_320);
        auVar113 = vfmadd231ps_avx512vl(auVar104,auVar109,auVar113);
        auVar104 = vfmadd231ps_avx512vl(auVar112,auVar114,local_2c0);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar114,local_2e0);
        auVar112 = vfmadd231ps_avx512vl(auVar113,local_4a0,auVar114);
        auVar95 = vfmadd231ps_fma(auVar104,auVar101,local_280);
        auVar104 = vfmadd231ps_avx512vl(auVar103,auVar101,local_2a0);
        auVar103 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1210);
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1b18);
        auVar113 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1f9c);
        auVar112 = vfmadd231ps_avx512vl(auVar112,local_480,auVar101);
        auVar36._4_4_ = fVar148 * auVar113._4_4_;
        auVar36._0_4_ = fVar148 * auVar113._0_4_;
        auVar36._8_4_ = fVar148 * auVar113._8_4_;
        auVar36._12_4_ = fVar148 * auVar113._12_4_;
        auVar36._16_4_ = fVar148 * auVar113._16_4_;
        auVar36._20_4_ = fVar148 * auVar113._20_4_;
        auVar36._24_4_ = fVar148 * auVar113._24_4_;
        auVar36._28_4_ = auVar101._28_4_;
        auVar101 = vmulps_avx512vl(_local_360,auVar113);
        auVar113 = vmulps_avx512vl(local_140,auVar113);
        auVar110 = vfmadd231ps_avx512vl(auVar36,auVar114,local_300);
        auVar111 = vfmadd231ps_avx512vl(auVar101,auVar114,local_320);
        auVar219 = ZEXT3264(local_480);
        auVar221 = ZEXT3264(local_4a0);
        auVar220 = ZEXT3264(auVar109);
        auVar114 = vfmadd231ps_avx512vl(auVar113,auVar109,auVar114);
        auVar101 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1694);
        auVar113 = vfmadd231ps_avx512vl(auVar110,auVar101,local_2c0);
        auVar110 = vfmadd231ps_avx512vl(auVar111,auVar101,local_2e0);
        auVar101 = vfmadd231ps_avx512vl(auVar114,local_4a0,auVar101);
        auVar96 = vfmadd231ps_fma(auVar113,auVar103,local_280);
        auVar114 = vfmadd231ps_avx512vl(auVar110,auVar103,local_2a0);
        auVar113 = vfmadd231ps_avx512vl(auVar101,local_480,auVar103);
        auVar214._8_4_ = 0x7fffffff;
        auVar214._0_8_ = 0x7fffffff7fffffff;
        auVar214._12_4_ = 0x7fffffff;
        auVar214._16_4_ = 0x7fffffff;
        auVar214._20_4_ = 0x7fffffff;
        auVar214._24_4_ = 0x7fffffff;
        auVar214._28_4_ = 0x7fffffff;
        auVar103 = vandps_avx(ZEXT1632(auVar95),auVar214);
        auVar101 = vandps_avx(auVar104,auVar214);
        auVar101 = vmaxps_avx(auVar103,auVar101);
        auVar103 = vandps_avx(auVar112,auVar214);
        auVar103 = vmaxps_avx(auVar101,auVar103);
        auVar209._4_4_ = fVar165;
        auVar209._0_4_ = fVar165;
        auVar209._8_4_ = fVar165;
        auVar209._12_4_ = fVar165;
        auVar209._16_4_ = fVar165;
        auVar209._20_4_ = fVar165;
        auVar209._24_4_ = fVar165;
        auVar209._28_4_ = fVar165;
        uVar77 = vcmpps_avx512vl(auVar103,auVar209,1);
        bVar17 = (bool)((byte)uVar77 & 1);
        auVar115._0_4_ = (float)((uint)bVar17 * auVar100._0_4_ | (uint)!bVar17 * auVar95._0_4_);
        bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar17 * auVar100._4_4_ | (uint)!bVar17 * auVar95._4_4_);
        bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar17 * auVar100._8_4_ | (uint)!bVar17 * auVar95._8_4_);
        bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar17 * auVar100._12_4_ | (uint)!bVar17 * auVar95._12_4_);
        fVar161 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar100._16_4_);
        auVar115._16_4_ = fVar161;
        fVar165 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar100._20_4_);
        auVar115._20_4_ = fVar165;
        fVar148 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar100._24_4_);
        auVar115._24_4_ = fVar148;
        uVar78 = (uint)(byte)(uVar77 >> 7) * auVar100._28_4_;
        auVar115._28_4_ = uVar78;
        bVar17 = (bool)((byte)uVar77 & 1);
        auVar116._0_4_ = (float)((uint)bVar17 * auVar108._0_4_ | (uint)!bVar17 * auVar104._0_4_);
        bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar17 * auVar108._4_4_ | (uint)!bVar17 * auVar104._4_4_);
        bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar17 * auVar108._8_4_ | (uint)!bVar17 * auVar104._8_4_);
        bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar17 * auVar108._12_4_ | (uint)!bVar17 * auVar104._12_4_);
        bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar17 * auVar108._16_4_ | (uint)!bVar17 * auVar104._16_4_);
        bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar17 * auVar108._20_4_ | (uint)!bVar17 * auVar104._20_4_);
        bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar17 * auVar108._24_4_ | (uint)!bVar17 * auVar104._24_4_);
        bVar17 = SUB81(uVar77 >> 7,0);
        auVar116._28_4_ = (uint)bVar17 * auVar108._28_4_ | (uint)!bVar17 * auVar104._28_4_;
        auVar103 = vandps_avx(auVar214,ZEXT1632(auVar96));
        auVar101 = vandps_avx(auVar114,auVar214);
        auVar101 = vmaxps_avx(auVar103,auVar101);
        auVar103 = vandps_avx(auVar113,auVar214);
        auVar103 = vmaxps_avx(auVar101,auVar103);
        uVar77 = vcmpps_avx512vl(auVar103,auVar209,1);
        bVar17 = (bool)((byte)uVar77 & 1);
        auVar117._0_4_ = (float)((uint)bVar17 * auVar100._0_4_ | (uint)!bVar17 * auVar96._0_4_);
        bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar17 * auVar100._4_4_ | (uint)!bVar17 * auVar96._4_4_);
        bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar17 * auVar100._8_4_ | (uint)!bVar17 * auVar96._8_4_);
        bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar17 * auVar100._12_4_ | (uint)!bVar17 * auVar96._12_4_);
        fVar162 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar100._16_4_);
        auVar117._16_4_ = fVar162;
        fVar172 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar100._20_4_);
        auVar117._20_4_ = fVar172;
        fVar186 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar100._24_4_);
        auVar117._24_4_ = fVar186;
        auVar117._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar100._28_4_;
        bVar17 = (bool)((byte)uVar77 & 1);
        auVar118._0_4_ = (float)((uint)bVar17 * auVar108._0_4_ | (uint)!bVar17 * auVar114._0_4_);
        bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar17 * auVar108._4_4_ | (uint)!bVar17 * auVar114._4_4_);
        bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar17 * auVar108._8_4_ | (uint)!bVar17 * auVar114._8_4_);
        bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar17 * auVar108._12_4_ | (uint)!bVar17 * auVar114._12_4_);
        bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar17 * auVar108._16_4_ | (uint)!bVar17 * auVar114._16_4_);
        bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar17 * auVar108._20_4_ | (uint)!bVar17 * auVar114._20_4_);
        bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar17 * auVar108._24_4_ | (uint)!bVar17 * auVar114._24_4_);
        bVar17 = SUB81(uVar77 >> 7,0);
        auVar118._28_4_ = (uint)bVar17 * auVar108._28_4_ | (uint)!bVar17 * auVar114._28_4_;
        auVar97 = vxorps_avx512vl(auVar97,auVar97);
        auVar103 = vfmadd213ps_avx512vl(auVar115,auVar115,ZEXT1632(auVar97));
        auVar95 = vfmadd231ps_fma(auVar103,auVar116,auVar116);
        auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
        fVar88 = auVar103._0_4_;
        fVar89 = auVar103._4_4_;
        fVar171 = auVar103._8_4_;
        fVar140 = auVar103._12_4_;
        fVar141 = auVar103._16_4_;
        fVar142 = auVar103._20_4_;
        fVar144 = auVar103._24_4_;
        auVar37._4_4_ = fVar89 * fVar89 * fVar89 * auVar95._4_4_ * -0.5;
        auVar37._0_4_ = fVar88 * fVar88 * fVar88 * auVar95._0_4_ * -0.5;
        auVar37._8_4_ = fVar171 * fVar171 * fVar171 * auVar95._8_4_ * -0.5;
        auVar37._12_4_ = fVar140 * fVar140 * fVar140 * auVar95._12_4_ * -0.5;
        auVar37._16_4_ = fVar141 * fVar141 * fVar141 * -0.0;
        auVar37._20_4_ = fVar142 * fVar142 * fVar142 * -0.0;
        auVar37._24_4_ = fVar144 * fVar144 * fVar144 * -0.0;
        auVar37._28_4_ = 0;
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar114 = vfmadd231ps_avx512vl(auVar37,auVar101,auVar103);
        auVar38._4_4_ = auVar116._4_4_ * auVar114._4_4_;
        auVar38._0_4_ = auVar116._0_4_ * auVar114._0_4_;
        auVar38._8_4_ = auVar116._8_4_ * auVar114._8_4_;
        auVar38._12_4_ = auVar116._12_4_ * auVar114._12_4_;
        auVar38._16_4_ = auVar116._16_4_ * auVar114._16_4_;
        auVar38._20_4_ = auVar116._20_4_ * auVar114._20_4_;
        auVar38._24_4_ = auVar116._24_4_ * auVar114._24_4_;
        auVar38._28_4_ = auVar103._28_4_;
        auVar39._4_4_ = auVar114._4_4_ * -auVar115._4_4_;
        auVar39._0_4_ = auVar114._0_4_ * -auVar115._0_4_;
        auVar39._8_4_ = auVar114._8_4_ * -auVar115._8_4_;
        auVar39._12_4_ = auVar114._12_4_ * -auVar115._12_4_;
        auVar39._16_4_ = auVar114._16_4_ * -fVar161;
        auVar39._20_4_ = auVar114._20_4_ * -fVar165;
        auVar39._24_4_ = auVar114._24_4_ * -fVar148;
        auVar39._28_4_ = uVar78 ^ 0x80000000;
        auVar103 = vmulps_avx512vl(auVar114,ZEXT1632(auVar97));
        auVar112 = ZEXT1632(auVar97);
        auVar113 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar112);
        auVar95 = vfmadd231ps_fma(auVar113,auVar118,auVar118);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
        fVar165 = auVar113._0_4_;
        fVar148 = auVar113._4_4_;
        fVar161 = auVar113._8_4_;
        fVar88 = auVar113._12_4_;
        fVar89 = auVar113._16_4_;
        fVar171 = auVar113._20_4_;
        fVar140 = auVar113._24_4_;
        auVar40._4_4_ = fVar148 * fVar148 * fVar148 * auVar95._4_4_ * -0.5;
        auVar40._0_4_ = fVar165 * fVar165 * fVar165 * auVar95._0_4_ * -0.5;
        auVar40._8_4_ = fVar161 * fVar161 * fVar161 * auVar95._8_4_ * -0.5;
        auVar40._12_4_ = fVar88 * fVar88 * fVar88 * auVar95._12_4_ * -0.5;
        auVar40._16_4_ = fVar89 * fVar89 * fVar89 * -0.0;
        auVar40._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
        auVar40._24_4_ = fVar140 * fVar140 * fVar140 * -0.0;
        auVar40._28_4_ = 0;
        auVar101 = vfmadd231ps_avx512vl(auVar40,auVar101,auVar113);
        auVar41._4_4_ = auVar118._4_4_ * auVar101._4_4_;
        auVar41._0_4_ = auVar118._0_4_ * auVar101._0_4_;
        auVar41._8_4_ = auVar118._8_4_ * auVar101._8_4_;
        auVar41._12_4_ = auVar118._12_4_ * auVar101._12_4_;
        auVar41._16_4_ = auVar118._16_4_ * auVar101._16_4_;
        auVar41._20_4_ = auVar118._20_4_ * auVar101._20_4_;
        auVar41._24_4_ = auVar118._24_4_ * auVar101._24_4_;
        auVar41._28_4_ = auVar113._28_4_;
        auVar42._4_4_ = -auVar117._4_4_ * auVar101._4_4_;
        auVar42._0_4_ = -auVar117._0_4_ * auVar101._0_4_;
        auVar42._8_4_ = -auVar117._8_4_ * auVar101._8_4_;
        auVar42._12_4_ = -auVar117._12_4_ * auVar101._12_4_;
        auVar42._16_4_ = -fVar162 * auVar101._16_4_;
        auVar42._20_4_ = -fVar172 * auVar101._20_4_;
        auVar42._24_4_ = -fVar186 * auVar101._24_4_;
        auVar42._28_4_ = auVar114._28_4_;
        auVar101 = vmulps_avx512vl(auVar101,auVar112);
        auVar95 = vfmadd213ps_fma(auVar38,auVar98,auVar106);
        auVar96 = vfmadd213ps_fma(auVar39,auVar98,auVar107);
        auVar114 = vfmadd213ps_avx512vl(auVar103,auVar98,auVar105);
        auVar113 = vfmadd213ps_avx512vl(auVar41,auVar99,ZEXT1632(auVar152));
        auVar202 = vfnmadd213ps_fma(auVar38,auVar98,auVar106);
        auVar94 = vfmadd213ps_fma(auVar42,auVar99,ZEXT1632(auVar91));
        auVar173 = vfnmadd213ps_fma(auVar39,auVar98,auVar107);
        auVar93 = vfmadd213ps_fma(auVar101,auVar99,auVar102);
        auVar104 = vfnmadd231ps_avx512vl(auVar105,auVar98,auVar103);
        auVar28 = vfnmadd213ps_fma(auVar41,auVar99,ZEXT1632(auVar152));
        auVar91 = vfnmadd213ps_fma(auVar42,auVar99,ZEXT1632(auVar91));
        auVar92 = vfnmadd231ps_fma(auVar102,auVar99,auVar101);
        auVar101 = vsubps_avx512vl(auVar113,ZEXT1632(auVar202));
        auVar103 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar173));
        auVar102 = vsubps_avx512vl(ZEXT1632(auVar93),auVar104);
        auVar105 = vmulps_avx512vl(auVar103,auVar104);
        auVar152 = vfmsub231ps_fma(auVar105,ZEXT1632(auVar173),auVar102);
        auVar43._4_4_ = auVar202._4_4_ * auVar102._4_4_;
        auVar43._0_4_ = auVar202._0_4_ * auVar102._0_4_;
        auVar43._8_4_ = auVar202._8_4_ * auVar102._8_4_;
        auVar43._12_4_ = auVar202._12_4_ * auVar102._12_4_;
        auVar43._16_4_ = auVar102._16_4_ * 0.0;
        auVar43._20_4_ = auVar102._20_4_ * 0.0;
        auVar43._24_4_ = auVar102._24_4_ * 0.0;
        auVar43._28_4_ = auVar102._28_4_;
        auVar102 = vfmsub231ps_avx512vl(auVar43,auVar104,auVar101);
        auVar44._4_4_ = auVar173._4_4_ * auVar101._4_4_;
        auVar44._0_4_ = auVar173._0_4_ * auVar101._0_4_;
        auVar44._8_4_ = auVar173._8_4_ * auVar101._8_4_;
        auVar44._12_4_ = auVar173._12_4_ * auVar101._12_4_;
        auVar44._16_4_ = auVar101._16_4_ * 0.0;
        auVar44._20_4_ = auVar101._20_4_ * 0.0;
        auVar44._24_4_ = auVar101._24_4_ * 0.0;
        auVar44._28_4_ = auVar101._28_4_;
        auVar90 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar202),auVar103);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar112,auVar102);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar112,ZEXT1632(auVar152));
        auVar108 = ZEXT1632(auVar97);
        uVar77 = vcmpps_avx512vl(auVar103,auVar108,2);
        bVar76 = (byte)uVar77;
        fVar88 = (float)((uint)(bVar76 & 1) * auVar95._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar28._0_4_);
        bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
        fVar171 = (float)((uint)bVar17 * auVar95._4_4_ | (uint)!bVar17 * auVar28._4_4_);
        bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
        fVar141 = (float)((uint)bVar17 * auVar95._8_4_ | (uint)!bVar17 * auVar28._8_4_);
        bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
        fVar144 = (float)((uint)bVar17 * auVar95._12_4_ | (uint)!bVar17 * auVar28._12_4_);
        auVar105 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar141,CONCAT44(fVar171,fVar88))));
        fVar89 = (float)((uint)(bVar76 & 1) * auVar96._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar91._0_4_);
        bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
        fVar140 = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar91._4_4_);
        bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
        fVar142 = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar91._8_4_);
        bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
        fVar145 = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar91._12_4_);
        auVar112 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar142,CONCAT44(fVar140,fVar89))));
        auVar119._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar92._0_4_
                    );
        bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar17 * auVar114._4_4_ | (uint)!bVar17 * auVar92._4_4_);
        bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar17 * auVar114._8_4_ | (uint)!bVar17 * auVar92._8_4_);
        bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar17 * auVar114._12_4_ | (uint)!bVar17 * auVar92._12_4_);
        fVar161 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar114._16_4_);
        auVar119._16_4_ = fVar161;
        fVar148 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar114._20_4_);
        auVar119._20_4_ = fVar148;
        fVar165 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar114._24_4_);
        auVar119._24_4_ = fVar165;
        iVar1 = (uint)(byte)(uVar77 >> 7) * auVar114._28_4_;
        auVar119._28_4_ = iVar1;
        auVar101 = vblendmps_avx512vl(ZEXT1632(auVar202),auVar113);
        auVar120._0_4_ =
             (uint)(bVar76 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar152._0_4_;
        bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * auVar152._4_4_;
        bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * auVar152._8_4_;
        bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * auVar152._12_4_;
        auVar120._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * auVar101._16_4_;
        auVar120._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * auVar101._20_4_;
        auVar120._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * auVar101._24_4_;
        auVar120._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar101._28_4_;
        auVar101 = vblendmps_avx512vl(ZEXT1632(auVar173),ZEXT1632(auVar94));
        auVar121._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar96._0_4_
                    );
        bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * auVar96._4_4_);
        bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * auVar96._8_4_);
        bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * auVar96._12_4_);
        fVar186 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar101._16_4_);
        auVar121._16_4_ = fVar186;
        fVar172 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar101._20_4_);
        auVar121._20_4_ = fVar172;
        fVar162 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar101._24_4_);
        auVar121._24_4_ = fVar162;
        auVar121._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar101._28_4_;
        auVar101 = vblendmps_avx512vl(auVar104,ZEXT1632(auVar93));
        auVar122._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar101._0_4_ |
                    (uint)!(bool)(bVar76 & 1) * auVar114._0_4_);
        bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * auVar114._4_4_);
        bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * auVar114._8_4_);
        bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * auVar114._12_4_);
        bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar122._16_4_ = (float)((uint)bVar17 * auVar101._16_4_ | (uint)!bVar17 * auVar114._16_4_);
        bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar122._20_4_ = (float)((uint)bVar17 * auVar101._20_4_ | (uint)!bVar17 * auVar114._20_4_);
        bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar122._24_4_ = (float)((uint)bVar17 * auVar101._24_4_ | (uint)!bVar17 * auVar114._24_4_);
        bVar17 = SUB81(uVar77 >> 7,0);
        auVar122._28_4_ = (uint)bVar17 * auVar101._28_4_ | (uint)!bVar17 * auVar114._28_4_;
        auVar123._0_4_ =
             (uint)(bVar76 & 1) * (int)auVar202._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar113._0_4_;
        bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar17 * (int)auVar202._4_4_ | (uint)!bVar17 * auVar113._4_4_;
        bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar17 * (int)auVar202._8_4_ | (uint)!bVar17 * auVar113._8_4_;
        bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar17 * (int)auVar202._12_4_ | (uint)!bVar17 * auVar113._12_4_;
        auVar123._16_4_ = (uint)!(bool)((byte)(uVar77 >> 4) & 1) * auVar113._16_4_;
        auVar123._20_4_ = (uint)!(bool)((byte)(uVar77 >> 5) & 1) * auVar113._20_4_;
        auVar123._24_4_ = (uint)!(bool)((byte)(uVar77 >> 6) & 1) * auVar113._24_4_;
        auVar123._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar113._28_4_;
        bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar77 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar124._0_4_ =
             (uint)(bVar76 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar93._0_4_;
        bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar18 * auVar104._4_4_ | (uint)!bVar18 * auVar93._4_4_;
        bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar18 * auVar104._8_4_ | (uint)!bVar18 * auVar93._8_4_;
        bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar18 * auVar104._12_4_ | (uint)!bVar18 * auVar93._12_4_;
        auVar124._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * auVar104._16_4_;
        auVar124._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * auVar104._20_4_;
        auVar124._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * auVar104._24_4_;
        iVar2 = (uint)(byte)(uVar77 >> 7) * auVar104._28_4_;
        auVar124._28_4_ = iVar2;
        auVar106 = vsubps_avx512vl(auVar123,auVar105);
        auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar173._12_4_ |
                                                 (uint)!bVar20 * auVar94._12_4_,
                                                 CONCAT48((uint)bVar19 * (int)auVar173._8_4_ |
                                                          (uint)!bVar19 * auVar94._8_4_,
                                                          CONCAT44((uint)bVar17 *
                                                                   (int)auVar173._4_4_ |
                                                                   (uint)!bVar17 * auVar94._4_4_,
                                                                   (uint)(bVar76 & 1) *
                                                                   (int)auVar173._0_4_ |
                                                                   (uint)!(bool)(bVar76 & 1) *
                                                                   auVar94._0_4_)))),auVar112);
        auVar197 = ZEXT3264(auVar101);
        auVar114 = vsubps_avx(auVar124,auVar119);
        auVar113 = vsubps_avx(auVar105,auVar120);
        auVar201 = ZEXT3264(auVar113);
        auVar104 = vsubps_avx(auVar112,auVar121);
        auVar102 = vsubps_avx(auVar119,auVar122);
        auVar45._4_4_ = auVar114._4_4_ * fVar171;
        auVar45._0_4_ = auVar114._0_4_ * fVar88;
        auVar45._8_4_ = auVar114._8_4_ * fVar141;
        auVar45._12_4_ = auVar114._12_4_ * fVar144;
        auVar45._16_4_ = auVar114._16_4_ * 0.0;
        auVar45._20_4_ = auVar114._20_4_ * 0.0;
        auVar45._24_4_ = auVar114._24_4_ * 0.0;
        auVar45._28_4_ = iVar2;
        auVar95 = vfmsub231ps_fma(auVar45,auVar119,auVar106);
        auVar46._4_4_ = fVar140 * auVar106._4_4_;
        auVar46._0_4_ = fVar89 * auVar106._0_4_;
        auVar46._8_4_ = fVar142 * auVar106._8_4_;
        auVar46._12_4_ = fVar145 * auVar106._12_4_;
        auVar46._16_4_ = auVar106._16_4_ * 0.0;
        auVar46._20_4_ = auVar106._20_4_ * 0.0;
        auVar46._24_4_ = auVar106._24_4_ * 0.0;
        auVar46._28_4_ = auVar103._28_4_;
        auVar96 = vfmsub231ps_fma(auVar46,auVar105,auVar101);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar108,ZEXT1632(auVar95));
        auVar188._0_4_ = auVar101._0_4_ * auVar119._0_4_;
        auVar188._4_4_ = auVar101._4_4_ * auVar119._4_4_;
        auVar188._8_4_ = auVar101._8_4_ * auVar119._8_4_;
        auVar188._12_4_ = auVar101._12_4_ * auVar119._12_4_;
        auVar188._16_4_ = auVar101._16_4_ * fVar161;
        auVar188._20_4_ = auVar101._20_4_ * fVar148;
        auVar188._24_4_ = auVar101._24_4_ * fVar165;
        auVar188._28_4_ = 0;
        auVar95 = vfmsub231ps_fma(auVar188,auVar112,auVar114);
        auVar107 = vfmadd231ps_avx512vl(auVar103,auVar108,ZEXT1632(auVar95));
        auVar103 = vmulps_avx512vl(auVar102,auVar120);
        auVar103 = vfmsub231ps_avx512vl(auVar103,auVar113,auVar122);
        auVar47._4_4_ = auVar104._4_4_ * auVar122._4_4_;
        auVar47._0_4_ = auVar104._0_4_ * auVar122._0_4_;
        auVar47._8_4_ = auVar104._8_4_ * auVar122._8_4_;
        auVar47._12_4_ = auVar104._12_4_ * auVar122._12_4_;
        auVar47._16_4_ = auVar104._16_4_ * auVar122._16_4_;
        auVar47._20_4_ = auVar104._20_4_ * auVar122._20_4_;
        auVar47._24_4_ = auVar104._24_4_ * auVar122._24_4_;
        auVar47._28_4_ = auVar122._28_4_;
        auVar95 = vfmsub231ps_fma(auVar47,auVar121,auVar102);
        auVar189._0_4_ = auVar121._0_4_ * auVar113._0_4_;
        auVar189._4_4_ = auVar121._4_4_ * auVar113._4_4_;
        auVar189._8_4_ = auVar121._8_4_ * auVar113._8_4_;
        auVar189._12_4_ = auVar121._12_4_ * auVar113._12_4_;
        auVar189._16_4_ = fVar186 * auVar113._16_4_;
        auVar189._20_4_ = fVar172 * auVar113._20_4_;
        auVar189._24_4_ = fVar162 * auVar113._24_4_;
        auVar189._28_4_ = 0;
        auVar96 = vfmsub231ps_fma(auVar189,auVar104,auVar120);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar108,auVar103);
        auVar100 = vfmadd231ps_avx512vl(auVar103,auVar108,ZEXT1632(auVar95));
        auVar192 = ZEXT3264(auVar100);
        auVar103 = vmaxps_avx(auVar107,auVar100);
        uVar24 = vcmpps_avx512vl(auVar103,auVar108,2);
        bVar86 = bVar86 & (byte)uVar24;
        if (bVar86 != 0) {
          uVar149 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar215._4_4_ = uVar149;
          auVar215._0_4_ = uVar149;
          auVar215._8_4_ = uVar149;
          auVar215._12_4_ = uVar149;
          auVar215._16_4_ = uVar149;
          auVar215._20_4_ = uVar149;
          auVar215._24_4_ = uVar149;
          auVar215._28_4_ = uVar149;
          auVar218 = ZEXT3264(auVar215);
          auVar48._4_4_ = auVar102._4_4_ * auVar101._4_4_;
          auVar48._0_4_ = auVar102._0_4_ * auVar101._0_4_;
          auVar48._8_4_ = auVar102._8_4_ * auVar101._8_4_;
          auVar48._12_4_ = auVar102._12_4_ * auVar101._12_4_;
          auVar48._16_4_ = auVar102._16_4_ * auVar101._16_4_;
          auVar48._20_4_ = auVar102._20_4_ * auVar101._20_4_;
          auVar48._24_4_ = auVar102._24_4_ * auVar101._24_4_;
          auVar48._28_4_ = auVar103._28_4_;
          auVar152 = vfmsub231ps_fma(auVar48,auVar104,auVar114);
          auVar49._4_4_ = auVar114._4_4_ * auVar113._4_4_;
          auVar49._0_4_ = auVar114._0_4_ * auVar113._0_4_;
          auVar49._8_4_ = auVar114._8_4_ * auVar113._8_4_;
          auVar49._12_4_ = auVar114._12_4_ * auVar113._12_4_;
          auVar49._16_4_ = auVar114._16_4_ * auVar113._16_4_;
          auVar49._20_4_ = auVar114._20_4_ * auVar113._20_4_;
          auVar49._24_4_ = auVar114._24_4_ * auVar113._24_4_;
          auVar49._28_4_ = auVar114._28_4_;
          auVar94 = vfmsub231ps_fma(auVar49,auVar106,auVar102);
          auVar50._4_4_ = auVar104._4_4_ * auVar106._4_4_;
          auVar50._0_4_ = auVar104._0_4_ * auVar106._0_4_;
          auVar50._8_4_ = auVar104._8_4_ * auVar106._8_4_;
          auVar50._12_4_ = auVar104._12_4_ * auVar106._12_4_;
          auVar50._16_4_ = auVar104._16_4_ * auVar106._16_4_;
          auVar50._20_4_ = auVar104._20_4_ * auVar106._20_4_;
          auVar50._24_4_ = auVar104._24_4_ * auVar106._24_4_;
          auVar50._28_4_ = auVar104._28_4_;
          auVar93 = vfmsub231ps_fma(auVar50,auVar113,auVar101);
          auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar93));
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT1632(auVar152),
                                    ZEXT1232(ZEXT412(0)) << 0x20);
          auVar103 = vrcp14ps_avx512vl(ZEXT1632(auVar96));
          auVar201 = ZEXT3264(auVar103);
          auVar29._8_4_ = 0x3f800000;
          auVar29._0_8_ = 0x3f8000003f800000;
          auVar29._12_4_ = 0x3f800000;
          auVar29._16_4_ = 0x3f800000;
          auVar29._20_4_ = 0x3f800000;
          auVar29._24_4_ = 0x3f800000;
          auVar29._28_4_ = 0x3f800000;
          auVar101 = vfnmadd213ps_avx512vl(auVar103,ZEXT1632(auVar96),auVar29);
          auVar95 = vfmadd132ps_fma(auVar101,auVar103,auVar103);
          auVar197 = ZEXT1664(auVar95);
          auVar51._4_4_ = auVar93._4_4_ * auVar119._4_4_;
          auVar51._0_4_ = auVar93._0_4_ * auVar119._0_4_;
          auVar51._8_4_ = auVar93._8_4_ * auVar119._8_4_;
          auVar51._12_4_ = auVar93._12_4_ * auVar119._12_4_;
          auVar51._16_4_ = fVar161 * 0.0;
          auVar51._20_4_ = fVar148 * 0.0;
          auVar51._24_4_ = fVar165 * 0.0;
          auVar51._28_4_ = iVar1;
          auVar94 = vfmadd231ps_fma(auVar51,auVar112,ZEXT1632(auVar94));
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar105,ZEXT1632(auVar152));
          fVar165 = auVar95._0_4_;
          fVar148 = auVar95._4_4_;
          fVar161 = auVar95._8_4_;
          fVar162 = auVar95._12_4_;
          local_220 = ZEXT1632(CONCAT412(auVar94._12_4_ * fVar162,
                                         CONCAT48(auVar94._8_4_ * fVar161,
                                                  CONCAT44(auVar94._4_4_ * fVar148,
                                                           auVar94._0_4_ * fVar165))));
          auVar207 = ZEXT3264(local_220);
          auVar153._4_4_ = local_420;
          auVar153._0_4_ = local_420;
          auVar153._8_4_ = local_420;
          auVar153._12_4_ = local_420;
          auVar153._16_4_ = local_420;
          auVar153._20_4_ = local_420;
          auVar153._24_4_ = local_420;
          auVar153._28_4_ = local_420;
          uVar24 = vcmpps_avx512vl(local_220,auVar215,2);
          uVar25 = vcmpps_avx512vl(auVar153,local_220,2);
          bVar86 = (byte)uVar24 & (byte)uVar25 & bVar86;
          if (bVar86 != 0) {
            uVar81 = vcmpps_avx512vl(ZEXT1632(auVar96),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar81 = bVar86 & uVar81;
            if ((char)uVar81 != '\0') {
              fVar172 = auVar107._0_4_ * fVar165;
              fVar186 = auVar107._4_4_ * fVar148;
              auVar52._4_4_ = fVar186;
              auVar52._0_4_ = fVar172;
              fVar88 = auVar107._8_4_ * fVar161;
              auVar52._8_4_ = fVar88;
              fVar89 = auVar107._12_4_ * fVar162;
              auVar52._12_4_ = fVar89;
              fVar171 = auVar107._16_4_ * 0.0;
              auVar52._16_4_ = fVar171;
              fVar140 = auVar107._20_4_ * 0.0;
              auVar52._20_4_ = fVar140;
              fVar141 = auVar107._24_4_ * 0.0;
              auVar52._24_4_ = fVar141;
              auVar52._28_4_ = auVar107._28_4_;
              auVar154._8_4_ = 0x3f800000;
              auVar154._0_8_ = 0x3f8000003f800000;
              auVar154._12_4_ = 0x3f800000;
              auVar154._16_4_ = 0x3f800000;
              auVar154._20_4_ = 0x3f800000;
              auVar154._24_4_ = 0x3f800000;
              auVar154._28_4_ = 0x3f800000;
              auVar103 = vsubps_avx(auVar154,auVar52);
              local_260._0_4_ =
                   (float)((uint)(bVar76 & 1) * (int)fVar172 |
                          (uint)!(bool)(bVar76 & 1) * auVar103._0_4_);
              bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
              local_260._4_4_ =
                   (float)((uint)bVar17 * (int)fVar186 | (uint)!bVar17 * auVar103._4_4_);
              bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
              local_260._8_4_ = (float)((uint)bVar17 * (int)fVar88 | (uint)!bVar17 * auVar103._8_4_)
              ;
              bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
              local_260._12_4_ =
                   (float)((uint)bVar17 * (int)fVar89 | (uint)!bVar17 * auVar103._12_4_);
              bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
              local_260._16_4_ =
                   (float)((uint)bVar17 * (int)fVar171 | (uint)!bVar17 * auVar103._16_4_);
              bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
              local_260._20_4_ =
                   (float)((uint)bVar17 * (int)fVar140 | (uint)!bVar17 * auVar103._20_4_);
              bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
              local_260._24_4_ =
                   (float)((uint)bVar17 * (int)fVar141 | (uint)!bVar17 * auVar103._24_4_);
              bVar17 = SUB81(uVar77 >> 7,0);
              local_260._28_4_ =
                   (float)((uint)bVar17 * auVar107._28_4_ | (uint)!bVar17 * auVar103._28_4_);
              auVar103 = vsubps_avx(auVar99,auVar98);
              auVar95 = vfmadd213ps_fma(auVar103,local_260,auVar98);
              uVar149 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
              auVar30._4_4_ = uVar149;
              auVar30._0_4_ = uVar149;
              auVar30._8_4_ = uVar149;
              auVar30._12_4_ = uVar149;
              auVar30._16_4_ = uVar149;
              auVar30._20_4_ = uVar149;
              auVar30._24_4_ = uVar149;
              auVar30._28_4_ = uVar149;
              auVar103 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar95._12_4_ + auVar95._12_4_,
                                                            CONCAT48(auVar95._8_4_ + auVar95._8_4_,
                                                                     CONCAT44(auVar95._4_4_ +
                                                                              auVar95._4_4_,
                                                                              auVar95._0_4_ +
                                                                              auVar95._0_4_)))),
                                         auVar30);
              uVar87 = vcmpps_avx512vl(local_220,auVar103,6);
              uVar81 = uVar81 & uVar87;
              bVar86 = (byte)uVar81;
              if (bVar86 != 0) {
                auVar169._0_4_ = auVar100._0_4_ * fVar165;
                auVar169._4_4_ = auVar100._4_4_ * fVar148;
                auVar169._8_4_ = auVar100._8_4_ * fVar161;
                auVar169._12_4_ = auVar100._12_4_ * fVar162;
                auVar169._16_4_ = auVar100._16_4_ * 0.0;
                auVar169._20_4_ = auVar100._20_4_ * 0.0;
                auVar169._24_4_ = auVar100._24_4_ * 0.0;
                auVar169._28_4_ = 0;
                auVar183._8_4_ = 0x3f800000;
                auVar183._0_8_ = 0x3f8000003f800000;
                auVar183._12_4_ = 0x3f800000;
                auVar183._16_4_ = 0x3f800000;
                auVar183._20_4_ = 0x3f800000;
                auVar183._24_4_ = 0x3f800000;
                auVar183._28_4_ = 0x3f800000;
                auVar103 = vsubps_avx(auVar183,auVar169);
                auVar125._0_4_ =
                     (uint)(bVar76 & 1) * (int)auVar169._0_4_ |
                     (uint)!(bool)(bVar76 & 1) * auVar103._0_4_;
                bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
                auVar125._4_4_ = (uint)bVar17 * (int)auVar169._4_4_ | (uint)!bVar17 * auVar103._4_4_
                ;
                bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
                auVar125._8_4_ = (uint)bVar17 * (int)auVar169._8_4_ | (uint)!bVar17 * auVar103._8_4_
                ;
                bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
                auVar125._12_4_ =
                     (uint)bVar17 * (int)auVar169._12_4_ | (uint)!bVar17 * auVar103._12_4_;
                bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
                auVar125._16_4_ =
                     (uint)bVar17 * (int)auVar169._16_4_ | (uint)!bVar17 * auVar103._16_4_;
                bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
                auVar125._20_4_ =
                     (uint)bVar17 * (int)auVar169._20_4_ | (uint)!bVar17 * auVar103._20_4_;
                bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                auVar125._24_4_ =
                     (uint)bVar17 * (int)auVar169._24_4_ | (uint)!bVar17 * auVar103._24_4_;
                auVar125._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar103._28_4_;
                auVar31._8_4_ = 0x40000000;
                auVar31._0_8_ = 0x4000000040000000;
                auVar31._12_4_ = 0x40000000;
                auVar31._16_4_ = 0x40000000;
                auVar31._20_4_ = 0x40000000;
                auVar31._24_4_ = 0x40000000;
                auVar31._28_4_ = 0x40000000;
                local_240 = vfmsub132ps_avx512vl(auVar125,auVar183,auVar31);
                local_200 = 0;
                local_1fc = iVar80;
                auVar205 = ZEXT1664(local_5b0);
                local_1f0 = local_5b0;
                local_1e0 = uVar23;
                uStack_1d8 = uVar26;
                local_1d0 = uVar71;
                uStack_1c8 = uVar72;
                local_1c0 = uVar73;
                uStack_1b8 = uVar74;
                if ((pGVar85->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar165 = 1.0 / (float)local_570._0_4_;
                  local_1a0[0] = fVar165 * (local_260._0_4_ + 0.0);
                  local_1a0[1] = fVar165 * (local_260._4_4_ + 1.0);
                  local_1a0[2] = fVar165 * (local_260._8_4_ + 2.0);
                  local_1a0[3] = fVar165 * (local_260._12_4_ + 3.0);
                  fStack_190 = fVar165 * (local_260._16_4_ + 4.0);
                  fStack_18c = fVar165 * (local_260._20_4_ + 5.0);
                  fStack_188 = fVar165 * (local_260._24_4_ + 6.0);
                  fStack_184 = local_260._28_4_ + 7.0;
                  local_180 = local_240;
                  local_160 = local_220;
                  auVar155._8_4_ = 0x7f800000;
                  auVar155._0_8_ = 0x7f8000007f800000;
                  auVar155._12_4_ = 0x7f800000;
                  auVar155._16_4_ = 0x7f800000;
                  auVar155._20_4_ = 0x7f800000;
                  auVar155._24_4_ = 0x7f800000;
                  auVar155._28_4_ = 0x7f800000;
                  auVar103 = vblendmps_avx512vl(auVar155,local_220);
                  auVar126._0_4_ =
                       (uint)(bVar86 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar81 >> 1) & 1);
                  auVar126._4_4_ = (uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar81 >> 2) & 1);
                  auVar126._8_4_ = (uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar81 >> 3) & 1);
                  auVar126._12_4_ = (uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar81 >> 4) & 1);
                  auVar126._16_4_ = (uint)bVar17 * auVar103._16_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar81 >> 5) & 1);
                  auVar126._20_4_ = (uint)bVar17 * auVar103._20_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar81 >> 6) & 1);
                  auVar126._24_4_ = (uint)bVar17 * auVar103._24_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = SUB81(uVar81 >> 7,0);
                  auVar126._28_4_ = (uint)bVar17 * auVar103._28_4_ | (uint)!bVar17 * 0x7f800000;
                  auVar103 = vshufps_avx(auVar126,auVar126,0xb1);
                  auVar103 = vminps_avx(auVar126,auVar103);
                  auVar101 = vshufpd_avx(auVar103,auVar103,5);
                  auVar103 = vminps_avx(auVar103,auVar101);
                  auVar101 = vpermpd_avx2(auVar103,0x4e);
                  auVar103 = vminps_avx(auVar103,auVar101);
                  uVar24 = vcmpps_avx512vl(auVar126,auVar103,0);
                  uVar78 = (uint)uVar81;
                  if (((byte)uVar24 & bVar86) != 0) {
                    uVar78 = (uint)((byte)uVar24 & bVar86);
                  }
                  uVar79 = 0;
                  for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
                    uVar79 = uVar79 + 1;
                  }
                  uVar77 = (ulong)uVar79;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar85->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_560 = vpbroadcastd_avx512vl();
                    auVar95 = vpbroadcastd_avx512vl();
                    local_460._0_16_ = auVar95;
                    local_540 = auVar109;
                    local_4e0 = local_220;
                    local_4c0 = pGVar85;
                    do {
                      fVar165 = local_1a0[uVar77];
                      local_3c0._4_4_ = fVar165;
                      local_3c0._0_4_ = fVar165;
                      local_3c0._8_4_ = fVar165;
                      local_3c0._12_4_ = fVar165;
                      local_3b0 = *(undefined4 *)(local_180 + uVar77 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar77 * 4);
                      local_5a0.context = context->user;
                      fVar148 = 1.0 - fVar165;
                      auVar152 = vfnmadd231ss_fma(ZEXT416((uint)(fVar165 * (fVar148 + fVar148))),
                                                  ZEXT416((uint)fVar148),ZEXT416((uint)fVar148));
                      auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3c0,
                                                ZEXT416(0xc0a00000));
                      auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165 * 3.0)),
                                                ZEXT416((uint)(fVar165 + fVar165)),auVar95);
                      auVar201 = ZEXT1664(auVar94);
                      auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3c0,
                                                ZEXT416(0x40000000));
                      auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148 * -3.0)),
                                                ZEXT416((uint)(fVar148 + fVar148)),auVar95);
                      auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165)),local_3c0,
                                                ZEXT416((uint)(fVar148 * -2.0)));
                      fVar165 = auVar152._0_4_ * 0.5;
                      fVar148 = auVar94._0_4_ * 0.5;
                      fVar161 = auVar95._0_4_ * 0.5;
                      fVar162 = auVar96._0_4_ * 0.5;
                      auVar93._0_4_ = fVar162 * local_5f0;
                      auVar93._4_4_ = fVar162 * fStack_5ec;
                      auVar93._8_4_ = fVar162 * fStack_5e8;
                      auVar93._12_4_ = fVar162 * fStack_5e4;
                      auVar196._4_4_ = fVar161;
                      auVar196._0_4_ = fVar161;
                      auVar196._8_4_ = fVar161;
                      auVar196._12_4_ = fVar161;
                      auVar95 = vfmadd132ps_fma(auVar196,auVar93,auVar150);
                      auVar197 = ZEXT1664(auVar95);
                      auVar181._4_4_ = fVar148;
                      auVar181._0_4_ = fVar148;
                      auVar181._8_4_ = fVar148;
                      auVar181._12_4_ = fVar148;
                      auVar96 = vfmadd132ps_fma(auVar181,auVar95,auVar8);
                      auVar152._4_4_ = fVar165;
                      auVar152._0_4_ = fVar165;
                      auVar152._8_4_ = fVar165;
                      auVar152._12_4_ = fVar165;
                      auVar96 = vfmadd213ps_fma(auVar152,auVar205._0_16_,auVar96);
                      local_3f0 = auVar96._0_4_;
                      local_3e0 = vshufps_avx(auVar96,auVar96,0x55);
                      auVar192 = ZEXT1664(local_3e0);
                      local_3d0 = vshufps_avx(auVar96,auVar96,0xaa);
                      iStack_3ec = local_3f0;
                      iStack_3e8 = local_3f0;
                      iStack_3e4 = local_3f0;
                      uStack_3ac = local_3b0;
                      uStack_3a8 = local_3b0;
                      uStack_3a4 = local_3b0;
                      local_3a0 = local_460._0_8_;
                      uStack_398 = local_460._8_8_;
                      local_390 = local_560;
                      vpcmpeqd_avx2(ZEXT1632(local_560),ZEXT1632(local_560));
                      uStack_37c = (local_5a0.context)->instID[0];
                      local_380 = uStack_37c;
                      uStack_378 = uStack_37c;
                      uStack_374 = uStack_37c;
                      uStack_370 = (local_5a0.context)->instPrimID[0];
                      uStack_36c = uStack_370;
                      uStack_368 = uStack_370;
                      uStack_364 = uStack_370;
                      local_5c0 = local_4f0;
                      local_5a0.valid = (int *)local_5c0;
                      local_5a0.geometryUserPtr = pGVar85->userPtr;
                      local_5a0.hit = (RTCHitN *)&local_3f0;
                      local_5a0.N = 4;
                      local_440 = auVar218._0_32_;
                      local_5a0.ray = (RTCRayN *)ray;
                      if (pGVar85->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar192 = ZEXT1664(local_3e0);
                        auVar197 = ZEXT1664(auVar95);
                        auVar201 = ZEXT1664(auVar94);
                        (*pGVar85->intersectionFilterN)(&local_5a0);
                        auVar207 = ZEXT3264(local_4e0);
                        auVar218 = ZEXT3264(local_440);
                        auVar220 = ZEXT3264(local_540);
                        auVar221 = ZEXT3264(local_4a0);
                        auVar219 = ZEXT3264(local_480);
                        auVar205 = ZEXT1664(local_5b0);
                        pGVar85 = local_4c0;
                      }
                      uVar87 = vptestmd_avx512vl(local_5c0,local_5c0);
                      if ((uVar87 & 0xf) == 0) {
LAB_01d25555:
                        *(int *)(ray + k * 4 + 0x80) = auVar218._0_4_;
                      }
                      else {
                        p_Var16 = context->args->filter;
                        if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar85->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar192 = ZEXT1664(auVar192._0_16_);
                          auVar197 = ZEXT1664(auVar197._0_16_);
                          auVar201 = ZEXT1664(auVar201._0_16_);
                          (*p_Var16)(&local_5a0);
                          auVar207 = ZEXT3264(local_4e0);
                          auVar218 = ZEXT3264(local_440);
                          auVar220 = ZEXT3264(local_540);
                          auVar221 = ZEXT3264(local_4a0);
                          auVar219 = ZEXT3264(local_480);
                          auVar205 = ZEXT1664(local_5b0);
                          pGVar85 = local_4c0;
                        }
                        uVar87 = vptestmd_avx512vl(local_5c0,local_5c0);
                        uVar87 = uVar87 & 0xf;
                        bVar86 = (byte)uVar87;
                        if (bVar86 == 0) goto LAB_01d25555;
                        iVar1 = *(int *)(local_5a0.hit + 4);
                        iVar2 = *(int *)(local_5a0.hit + 8);
                        iVar70 = *(int *)(local_5a0.hit + 0xc);
                        bVar17 = (bool)((byte)(uVar87 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar87 >> 2) & 1);
                        bVar19 = SUB81(uVar87 >> 3,0);
                        *(uint *)(local_5a0.ray + 0xc0) =
                             (uint)(bVar86 & 1) * *(int *)local_5a0.hit |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_5a0.ray + 0xc0);
                        *(uint *)(local_5a0.ray + 0xc4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_5a0.ray + 0xc4);
                        *(uint *)(local_5a0.ray + 200) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_5a0.ray + 200);
                        *(uint *)(local_5a0.ray + 0xcc) =
                             (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_5a0.ray + 0xcc);
                        iVar1 = *(int *)(local_5a0.hit + 0x14);
                        iVar2 = *(int *)(local_5a0.hit + 0x18);
                        iVar70 = *(int *)(local_5a0.hit + 0x1c);
                        bVar17 = (bool)((byte)(uVar87 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar87 >> 2) & 1);
                        bVar19 = SUB81(uVar87 >> 3,0);
                        *(uint *)(local_5a0.ray + 0xd0) =
                             (uint)(bVar86 & 1) * *(int *)(local_5a0.hit + 0x10) |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_5a0.ray + 0xd0);
                        *(uint *)(local_5a0.ray + 0xd4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_5a0.ray + 0xd4);
                        *(uint *)(local_5a0.ray + 0xd8) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_5a0.ray + 0xd8);
                        *(uint *)(local_5a0.ray + 0xdc) =
                             (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_5a0.ray + 0xdc);
                        iVar1 = *(int *)(local_5a0.hit + 0x24);
                        iVar2 = *(int *)(local_5a0.hit + 0x28);
                        iVar70 = *(int *)(local_5a0.hit + 0x2c);
                        bVar17 = (bool)((byte)(uVar87 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar87 >> 2) & 1);
                        bVar19 = SUB81(uVar87 >> 3,0);
                        *(uint *)(local_5a0.ray + 0xe0) =
                             (uint)(bVar86 & 1) * *(int *)(local_5a0.hit + 0x20) |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_5a0.ray + 0xe0);
                        *(uint *)(local_5a0.ray + 0xe4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_5a0.ray + 0xe4);
                        *(uint *)(local_5a0.ray + 0xe8) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_5a0.ray + 0xe8);
                        *(uint *)(local_5a0.ray + 0xec) =
                             (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_5a0.ray + 0xec);
                        iVar1 = *(int *)(local_5a0.hit + 0x34);
                        iVar2 = *(int *)(local_5a0.hit + 0x38);
                        iVar70 = *(int *)(local_5a0.hit + 0x3c);
                        bVar17 = (bool)((byte)(uVar87 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar87 >> 2) & 1);
                        bVar19 = SUB81(uVar87 >> 3,0);
                        *(uint *)(local_5a0.ray + 0xf0) =
                             (uint)(bVar86 & 1) * *(int *)(local_5a0.hit + 0x30) |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_5a0.ray + 0xf0);
                        *(uint *)(local_5a0.ray + 0xf4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_5a0.ray + 0xf4);
                        *(uint *)(local_5a0.ray + 0xf8) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_5a0.ray + 0xf8);
                        *(uint *)(local_5a0.ray + 0xfc) =
                             (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_5a0.ray + 0xfc);
                        iVar1 = *(int *)(local_5a0.hit + 0x44);
                        iVar2 = *(int *)(local_5a0.hit + 0x48);
                        iVar70 = *(int *)(local_5a0.hit + 0x4c);
                        bVar17 = (bool)((byte)(uVar87 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar87 >> 2) & 1);
                        bVar19 = SUB81(uVar87 >> 3,0);
                        *(uint *)(local_5a0.ray + 0x100) =
                             (uint)(bVar86 & 1) * *(int *)(local_5a0.hit + 0x40) |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_5a0.ray + 0x100);
                        *(uint *)(local_5a0.ray + 0x104) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_5a0.ray + 0x104);
                        *(uint *)(local_5a0.ray + 0x108) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_5a0.ray + 0x108);
                        *(uint *)(local_5a0.ray + 0x10c) =
                             (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_5a0.ray + 0x10c)
                        ;
                        auVar95 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x50));
                        *(undefined1 (*) [16])(local_5a0.ray + 0x110) = auVar95;
                        auVar95 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x60));
                        *(undefined1 (*) [16])(local_5a0.ray + 0x120) = auVar95;
                        auVar95 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x70));
                        *(undefined1 (*) [16])(local_5a0.ray + 0x130) = auVar95;
                        auVar95 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x80));
                        *(undefined1 (*) [16])(local_5a0.ray + 0x140) = auVar95;
                        auVar218 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                      }
                      auVar109 = auVar220._0_32_;
                      bVar86 = ~(byte)(1 << ((uint)uVar77 & 0x1f)) & (byte)uVar81;
                      uVar149 = auVar218._0_4_;
                      auVar159._4_4_ = uVar149;
                      auVar159._0_4_ = uVar149;
                      auVar159._8_4_ = uVar149;
                      auVar159._12_4_ = uVar149;
                      auVar159._16_4_ = uVar149;
                      auVar159._20_4_ = uVar149;
                      auVar159._24_4_ = uVar149;
                      auVar159._28_4_ = uVar149;
                      uVar24 = vcmpps_avx512vl(auVar207._0_32_,auVar159,2);
                      if ((bVar86 & (byte)uVar24) == 0) goto LAB_01d243ae;
                      bVar86 = bVar86 & (byte)uVar24;
                      uVar81 = (ulong)bVar86;
                      auVar160._8_4_ = 0x7f800000;
                      auVar160._0_8_ = 0x7f8000007f800000;
                      auVar160._12_4_ = 0x7f800000;
                      auVar160._16_4_ = 0x7f800000;
                      auVar160._20_4_ = 0x7f800000;
                      auVar160._24_4_ = 0x7f800000;
                      auVar160._28_4_ = 0x7f800000;
                      auVar103 = vblendmps_avx512vl(auVar160,auVar207._0_32_);
                      auVar139._0_4_ =
                           (uint)(bVar86 & 1) * auVar103._0_4_ |
                           (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                      bVar17 = (bool)(bVar86 >> 1 & 1);
                      auVar139._4_4_ = (uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar86 >> 2 & 1);
                      auVar139._8_4_ = (uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar86 >> 3 & 1);
                      auVar139._12_4_ = (uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar86 >> 4 & 1);
                      auVar139._16_4_ = (uint)bVar17 * auVar103._16_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar86 >> 5 & 1);
                      auVar139._20_4_ = (uint)bVar17 * auVar103._20_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar86 >> 6 & 1);
                      auVar139._24_4_ = (uint)bVar17 * auVar103._24_4_ | (uint)!bVar17 * 0x7f800000;
                      auVar139._28_4_ =
                           (uint)(bVar86 >> 7) * auVar103._28_4_ |
                           (uint)!(bool)(bVar86 >> 7) * 0x7f800000;
                      auVar103 = vshufps_avx(auVar139,auVar139,0xb1);
                      auVar103 = vminps_avx(auVar139,auVar103);
                      auVar101 = vshufpd_avx(auVar103,auVar103,5);
                      auVar103 = vminps_avx(auVar103,auVar101);
                      auVar101 = vpermpd_avx2(auVar103,0x4e);
                      auVar103 = vminps_avx(auVar103,auVar101);
                      uVar24 = vcmpps_avx512vl(auVar139,auVar103,0);
                      bVar76 = (byte)uVar24 & bVar86;
                      if (bVar76 != 0) {
                        bVar86 = bVar76;
                      }
                      uVar78 = 0;
                      for (uVar79 = (uint)bVar86; (uVar79 & 1) == 0;
                          uVar79 = uVar79 >> 1 | 0x80000000) {
                        uVar78 = uVar78 + 1;
                      }
                      uVar77 = (ulong)uVar78;
                    } while( true );
                  }
                  fVar165 = local_1a0[uVar77];
                  uVar149 = *(undefined4 *)(local_180 + uVar77 * 4);
                  fVar148 = 1.0 - fVar165;
                  auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar165 * (fVar148 + fVar148))),
                                            ZEXT416((uint)fVar148),ZEXT416((uint)fVar148));
                  auVar150 = ZEXT416((uint)fVar165);
                  auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar150,
                                            ZEXT416(0xc0a00000));
                  auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165 * 3.0)),
                                            ZEXT416((uint)(fVar165 + fVar165)),auVar95);
                  auVar201 = ZEXT1664(auVar96);
                  auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar150,
                                            ZEXT416(0x40000000));
                  auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148 * -3.0)),
                                            ZEXT416((uint)(fVar148 + fVar148)),auVar95);
                  auVar150 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165)),auVar150,
                                             ZEXT416((uint)(fVar148 * -2.0)));
                  fVar148 = auVar8._0_4_ * 0.5;
                  fVar161 = auVar96._0_4_ * 0.5;
                  auVar192 = ZEXT464((uint)fVar161);
                  fVar162 = auVar95._0_4_ * 0.5;
                  fVar172 = auVar150._0_4_ * 0.5;
                  auVar175._0_4_ = fVar172 * local_5f0;
                  auVar175._4_4_ = fVar172 * fStack_5ec;
                  auVar175._8_4_ = fVar172 * fStack_5e8;
                  auVar175._12_4_ = fVar172 * fStack_5e4;
                  auVar193._4_4_ = fVar162;
                  auVar193._0_4_ = fVar162;
                  auVar193._8_4_ = fVar162;
                  auVar193._12_4_ = fVar162;
                  auVar95 = vfmadd132ps_fma(auVar193,auVar175,*pauVar4);
                  auVar197 = ZEXT1664(auVar95);
                  auVar176._4_4_ = fVar161;
                  auVar176._0_4_ = fVar161;
                  auVar176._8_4_ = fVar161;
                  auVar176._12_4_ = fVar161;
                  auVar95 = vfmadd132ps_fma(auVar176,auVar95,*pauVar3);
                  auVar166._4_4_ = fVar148;
                  auVar166._0_4_ = fVar148;
                  auVar166._8_4_ = fVar148;
                  auVar166._12_4_ = fVar148;
                  auVar95 = vfmadd213ps_fma(auVar166,local_5b0,auVar95);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar77 * 4);
                  *(int *)(ray + k * 4 + 0xc0) = auVar95._0_4_;
                  uVar15 = vextractps_avx(auVar95,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar15;
                  uVar15 = vextractps_avx(auVar95,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar15;
                  *(float *)(ray + k * 4 + 0xf0) = fVar165;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar149;
                  *(uint *)(ray + k * 4 + 0x110) = uVar14;
                  *(uint *)(ray + k * 4 + 0x120) = uVar82;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01d243ae:
      if (8 < iVar80) {
        auVar103 = vpbroadcastd_avx512vl();
        auVar220 = ZEXT3264(auVar103);
        local_440._4_4_ = local_520._0_4_;
        local_440._0_4_ = local_520._0_4_;
        local_440._8_4_ = local_520._0_4_;
        local_440._12_4_ = local_520._0_4_;
        local_440._16_4_ = local_520._0_4_;
        local_440._20_4_ = local_520._0_4_;
        local_440._24_4_ = local_520._0_4_;
        local_440._28_4_ = local_520._0_4_;
        uStack_41c = local_420;
        uStack_418 = local_420;
        uStack_414 = local_420;
        uStack_410 = local_420;
        uStack_40c = local_420;
        uStack_408 = local_420;
        uStack_404 = local_420;
        fStack_4b8 = 1.0 / (float)local_570._0_4_;
        local_570 = vpbroadcastd_avx512vl();
        local_560 = vpbroadcastd_avx512vl();
        lVar84 = 8;
        local_540 = auVar109;
        fStack_4b4 = fStack_4b8;
        fStack_4b0 = fStack_4b8;
        fStack_4ac = fStack_4b8;
        fStack_4a8 = fStack_4b8;
        fStack_4a4 = fStack_4b8;
        local_4c0._0_4_ = fStack_4b8;
        local_4c0._4_4_ = fStack_4b8;
LAB_01d24458:
        auVar103 = vpbroadcastd_avx512vl();
        auVar103 = vpor_avx2(auVar103,_DAT_01fe9900);
        uVar25 = vpcmpgtd_avx512vl(auVar220._0_32_,auVar103);
        auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar84 * 4 + lVar27);
        auVar101 = *(undefined1 (*) [32])(lVar27 + 0x21b37f0 + lVar84 * 4);
        auVar114 = *(undefined1 (*) [32])(lVar27 + 0x21b3c74 + lVar84 * 4);
        auVar113 = *(undefined1 (*) [32])(lVar27 + 0x21b40f8 + lVar84 * 4);
        auVar207._0_4_ = auVar113._0_4_ * (float)local_340._0_4_;
        auVar207._4_4_ = auVar113._4_4_ * (float)local_340._4_4_;
        auVar207._8_4_ = auVar113._8_4_ * fStack_338;
        auVar207._12_4_ = auVar113._12_4_ * fStack_334;
        auVar207._16_4_ = auVar113._16_4_ * fStack_330;
        auVar207._20_4_ = auVar113._20_4_ * fStack_32c;
        auVar207._28_36_ = auVar197._28_36_;
        auVar207._24_4_ = auVar113._24_4_ * fStack_328;
        auVar197._0_4_ = auVar113._0_4_ * (float)local_360._0_4_;
        auVar197._4_4_ = auVar113._4_4_ * (float)local_360._4_4_;
        auVar197._8_4_ = auVar113._8_4_ * fStack_358;
        auVar197._12_4_ = auVar113._12_4_ * fStack_354;
        auVar197._16_4_ = auVar113._16_4_ * fStack_350;
        auVar197._20_4_ = auVar113._20_4_ * fStack_34c;
        auVar197._28_36_ = auVar192._28_36_;
        auVar197._24_4_ = auVar113._24_4_ * fStack_348;
        auVar104 = vmulps_avx512vl(local_100,auVar113);
        local_480 = auVar219._0_32_;
        auVar102 = vfmadd231ps_avx512vl(auVar207._0_32_,auVar114,local_300);
        auVar105 = vfmadd231ps_avx512vl(auVar197._0_32_,auVar114,local_320);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar114,local_e0);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar101,local_2c0);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar101,local_2e0);
        auVar112 = vfmadd231ps_avx512vl(auVar104,auVar101,local_c0);
        auVar95 = vfmadd231ps_fma(auVar102,auVar103,local_280);
        auVar197 = ZEXT1664(auVar95);
        auVar96 = vfmadd231ps_fma(auVar105,auVar103,local_2a0);
        auVar192 = ZEXT1664(auVar96);
        auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar84 * 4 + lVar27);
        auVar102 = *(undefined1 (*) [32])(lVar27 + 0x21b5c10 + lVar84 * 4);
        auVar100 = vfmadd231ps_avx512vl(auVar112,auVar103,local_a0);
        auVar105 = *(undefined1 (*) [32])(lVar27 + 0x21b6094 + lVar84 * 4);
        auVar112 = *(undefined1 (*) [32])(lVar27 + 0x21b6518 + lVar84 * 4);
        auVar219._0_4_ = auVar112._0_4_ * (float)local_340._0_4_;
        auVar219._4_4_ = auVar112._4_4_ * (float)local_340._4_4_;
        auVar219._8_4_ = auVar112._8_4_ * fStack_338;
        auVar219._12_4_ = auVar112._12_4_ * fStack_334;
        auVar219._16_4_ = auVar112._16_4_ * fStack_330;
        auVar219._20_4_ = auVar112._20_4_ * fStack_32c;
        auVar219._28_36_ = auVar201._28_36_;
        auVar219._24_4_ = auVar112._24_4_ * fStack_328;
        auVar53._4_4_ = auVar112._4_4_ * (float)local_360._4_4_;
        auVar53._0_4_ = auVar112._0_4_ * (float)local_360._0_4_;
        auVar53._8_4_ = auVar112._8_4_ * fStack_358;
        auVar53._12_4_ = auVar112._12_4_ * fStack_354;
        auVar53._16_4_ = auVar112._16_4_ * fStack_350;
        auVar53._20_4_ = auVar112._20_4_ * fStack_34c;
        auVar53._24_4_ = auVar112._24_4_ * fStack_348;
        auVar53._28_4_ = uStack_344;
        auVar106 = vmulps_avx512vl(local_100,auVar112);
        auVar107 = vfmadd231ps_avx512vl(auVar219._0_32_,auVar105,local_300);
        auVar219 = ZEXT3264(local_480);
        auVar108 = vfmadd231ps_avx512vl(auVar53,auVar105,local_320);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar105,local_e0);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar102,local_2c0);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar102,local_2e0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,local_c0);
        auVar150 = vfmadd231ps_fma(auVar107,auVar104,local_280);
        auVar201 = ZEXT1664(auVar150);
        auVar8 = vfmadd231ps_fma(auVar108,auVar104,local_2a0);
        auVar108 = vfmadd231ps_avx512vl(auVar106,auVar104,local_a0);
        auVar109 = vmaxps_avx512vl(auVar100,auVar108);
        auVar106 = vsubps_avx(ZEXT1632(auVar150),ZEXT1632(auVar95));
        auVar107 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar96));
        auVar98 = vmulps_avx512vl(ZEXT1632(auVar96),auVar106);
        auVar99 = vmulps_avx512vl(ZEXT1632(auVar95),auVar107);
        auVar98 = vsubps_avx512vl(auVar98,auVar99);
        auVar99 = vmulps_avx512vl(auVar107,auVar107);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar106,auVar106);
        auVar109 = vmulps_avx512vl(auVar109,auVar109);
        auVar109 = vmulps_avx512vl(auVar109,auVar99);
        auVar98 = vmulps_avx512vl(auVar98,auVar98);
        uVar24 = vcmpps_avx512vl(auVar98,auVar109,2);
        bVar86 = (byte)uVar25 & (byte)uVar24;
        if (bVar86 != 0) {
          auVar112 = vmulps_avx512vl(local_140,auVar112);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_540,auVar112);
          local_4a0 = auVar221._0_32_;
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_4a0,auVar105);
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_480,auVar102);
          auVar113 = vmulps_avx512vl(local_140,auVar113);
          auVar114 = vfmadd213ps_avx512vl(auVar114,local_540,auVar113);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_4a0,auVar114);
          auVar102 = vfmadd213ps_avx512vl(auVar103,local_480,auVar101);
          auVar103 = *(undefined1 (*) [32])(lVar27 + 0x21b457c + lVar84 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar27 + 0x21b4a00 + lVar84 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar27 + 0x21b4e84 + lVar84 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar27 + 0x21b5308 + lVar84 * 4);
          auVar105 = vmulps_avx512vl(_local_340,auVar113);
          auVar112 = vmulps_avx512vl(_local_360,auVar113);
          auVar113 = vmulps_avx512vl(local_140,auVar113);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar114,local_300);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar114,local_320);
          auVar94 = vfmadd231ps_fma(auVar113,auVar114,local_540);
          auVar114 = vfmadd231ps_avx512vl(auVar105,auVar101,local_2c0);
          auVar113 = vfmadd231ps_avx512vl(auVar112,auVar101,local_2e0);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),local_4a0,auVar101);
          auVar105 = vfmadd231ps_avx512vl(auVar114,auVar103,local_280);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar103,local_2a0);
          auVar112 = vfmadd231ps_avx512vl(auVar101,local_480,auVar103);
          auVar103 = *(undefined1 (*) [32])(lVar27 + 0x21b699c + lVar84 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar27 + 0x21b72a4 + lVar84 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar27 + 0x21b7728 + lVar84 * 4);
          auVar109 = vmulps_avx512vl(_local_340,auVar114);
          auVar98 = vmulps_avx512vl(_local_360,auVar114);
          auVar114 = vmulps_avx512vl(local_140,auVar114);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar101,local_300);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,local_320);
          auVar114 = vfmadd231ps_avx512vl(auVar114,local_540,auVar101);
          auVar101 = *(undefined1 (*) [32])(lVar27 + 0x21b6e20 + lVar84 * 4);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar101,local_2c0);
          auVar219 = ZEXT3264(local_480);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,local_2e0);
          auVar101 = vfmadd231ps_avx512vl(auVar114,local_4a0,auVar101);
          auVar114 = vfmadd231ps_avx512vl(auVar109,auVar103,local_280);
          auVar109 = vfmadd231ps_avx512vl(auVar98,auVar103,local_2a0);
          auVar101 = vfmadd231ps_avx512vl(auVar101,local_480,auVar103);
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar105,auVar98);
          vandps_avx512vl(auVar113,auVar98);
          auVar103 = vmaxps_avx(auVar98,auVar98);
          vandps_avx512vl(auVar112,auVar98);
          auVar103 = vmaxps_avx(auVar103,auVar98);
          uVar77 = vcmpps_avx512vl(auVar103,local_440,1);
          bVar17 = (bool)((byte)uVar77 & 1);
          auVar127._0_4_ = (float)((uint)bVar17 * auVar106._0_4_ | (uint)!bVar17 * auVar105._0_4_);
          bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar105._4_4_);
          bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar105._8_4_);
          bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar127._12_4_ =
               (float)((uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar105._12_4_);
          bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar127._16_4_ =
               (float)((uint)bVar17 * auVar106._16_4_ | (uint)!bVar17 * auVar105._16_4_);
          bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar127._20_4_ =
               (float)((uint)bVar17 * auVar106._20_4_ | (uint)!bVar17 * auVar105._20_4_);
          bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar127._24_4_ =
               (float)((uint)bVar17 * auVar106._24_4_ | (uint)!bVar17 * auVar105._24_4_);
          bVar17 = SUB81(uVar77 >> 7,0);
          auVar127._28_4_ = (uint)bVar17 * auVar106._28_4_ | (uint)!bVar17 * auVar105._28_4_;
          bVar17 = (bool)((byte)uVar77 & 1);
          auVar128._0_4_ = (float)((uint)bVar17 * auVar107._0_4_ | (uint)!bVar17 * auVar113._0_4_);
          bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar17 * auVar107._4_4_ | (uint)!bVar17 * auVar113._4_4_);
          bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar17 * auVar107._8_4_ | (uint)!bVar17 * auVar113._8_4_);
          bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar128._12_4_ =
               (float)((uint)bVar17 * auVar107._12_4_ | (uint)!bVar17 * auVar113._12_4_);
          bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar128._16_4_ =
               (float)((uint)bVar17 * auVar107._16_4_ | (uint)!bVar17 * auVar113._16_4_);
          bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar128._20_4_ =
               (float)((uint)bVar17 * auVar107._20_4_ | (uint)!bVar17 * auVar113._20_4_);
          bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar128._24_4_ =
               (float)((uint)bVar17 * auVar107._24_4_ | (uint)!bVar17 * auVar113._24_4_);
          bVar17 = SUB81(uVar77 >> 7,0);
          auVar128._28_4_ = (uint)bVar17 * auVar107._28_4_ | (uint)!bVar17 * auVar113._28_4_;
          vandps_avx512vl(auVar114,auVar98);
          vandps_avx512vl(auVar109,auVar98);
          auVar103 = vmaxps_avx(auVar128,auVar128);
          vandps_avx512vl(auVar101,auVar98);
          auVar103 = vmaxps_avx(auVar103,auVar128);
          uVar77 = vcmpps_avx512vl(auVar103,local_440,1);
          bVar17 = (bool)((byte)uVar77 & 1);
          auVar129._0_4_ = (uint)bVar17 * auVar106._0_4_ | (uint)!bVar17 * auVar114._0_4_;
          bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar114._4_4_;
          bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar114._8_4_;
          bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar114._12_4_;
          bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar129._16_4_ = (uint)bVar17 * auVar106._16_4_ | (uint)!bVar17 * auVar114._16_4_;
          bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar129._20_4_ = (uint)bVar17 * auVar106._20_4_ | (uint)!bVar17 * auVar114._20_4_;
          bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar129._24_4_ = (uint)bVar17 * auVar106._24_4_ | (uint)!bVar17 * auVar114._24_4_;
          bVar17 = SUB81(uVar77 >> 7,0);
          auVar129._28_4_ = (uint)bVar17 * auVar106._28_4_ | (uint)!bVar17 * auVar114._28_4_;
          bVar17 = (bool)((byte)uVar77 & 1);
          auVar130._0_4_ = (float)((uint)bVar17 * auVar107._0_4_ | (uint)!bVar17 * auVar109._0_4_);
          bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar130._4_4_ = (float)((uint)bVar17 * auVar107._4_4_ | (uint)!bVar17 * auVar109._4_4_);
          bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar130._8_4_ = (float)((uint)bVar17 * auVar107._8_4_ | (uint)!bVar17 * auVar109._8_4_);
          bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar130._12_4_ =
               (float)((uint)bVar17 * auVar107._12_4_ | (uint)!bVar17 * auVar109._12_4_);
          bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar130._16_4_ =
               (float)((uint)bVar17 * auVar107._16_4_ | (uint)!bVar17 * auVar109._16_4_);
          bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar130._20_4_ =
               (float)((uint)bVar17 * auVar107._20_4_ | (uint)!bVar17 * auVar109._20_4_);
          bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar130._24_4_ =
               (float)((uint)bVar17 * auVar107._24_4_ | (uint)!bVar17 * auVar109._24_4_);
          bVar17 = SUB81(uVar77 >> 7,0);
          auVar130._28_4_ = (uint)bVar17 * auVar107._28_4_ | (uint)!bVar17 * auVar109._28_4_;
          auVar204._8_4_ = 0x80000000;
          auVar204._0_8_ = 0x8000000080000000;
          auVar204._12_4_ = 0x80000000;
          auVar204._16_4_ = 0x80000000;
          auVar204._20_4_ = 0x80000000;
          auVar204._24_4_ = 0x80000000;
          auVar204._28_4_ = 0x80000000;
          auVar103 = vxorps_avx512vl(auVar129,auVar204);
          auVar97 = vxorps_avx512vl(auVar98._0_16_,auVar98._0_16_);
          auVar101 = vfmadd213ps_avx512vl(auVar127,auVar127,ZEXT1632(auVar97));
          auVar94 = vfmadd231ps_fma(auVar101,auVar128,auVar128);
          auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
          auVar216._8_4_ = 0xbf000000;
          auVar216._0_8_ = 0xbf000000bf000000;
          auVar216._12_4_ = 0xbf000000;
          auVar216._16_4_ = 0xbf000000;
          auVar216._20_4_ = 0xbf000000;
          auVar216._24_4_ = 0xbf000000;
          auVar216._28_4_ = 0xbf000000;
          fVar165 = auVar101._0_4_;
          fVar148 = auVar101._4_4_;
          fVar161 = auVar101._8_4_;
          fVar162 = auVar101._12_4_;
          fVar172 = auVar101._16_4_;
          fVar186 = auVar101._20_4_;
          fVar88 = auVar101._24_4_;
          auVar54._4_4_ = fVar148 * fVar148 * fVar148 * auVar94._4_4_ * -0.5;
          auVar54._0_4_ = fVar165 * fVar165 * fVar165 * auVar94._0_4_ * -0.5;
          auVar54._8_4_ = fVar161 * fVar161 * fVar161 * auVar94._8_4_ * -0.5;
          auVar54._12_4_ = fVar162 * fVar162 * fVar162 * auVar94._12_4_ * -0.5;
          auVar54._16_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar54._20_4_ = fVar186 * fVar186 * fVar186 * -0.0;
          auVar54._24_4_ = fVar88 * fVar88 * fVar88 * -0.0;
          auVar54._28_4_ = auVar128._28_4_;
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar101 = vfmadd231ps_avx512vl(auVar54,auVar114,auVar101);
          auVar55._4_4_ = auVar128._4_4_ * auVar101._4_4_;
          auVar55._0_4_ = auVar128._0_4_ * auVar101._0_4_;
          auVar55._8_4_ = auVar128._8_4_ * auVar101._8_4_;
          auVar55._12_4_ = auVar128._12_4_ * auVar101._12_4_;
          auVar55._16_4_ = auVar128._16_4_ * auVar101._16_4_;
          auVar55._20_4_ = auVar128._20_4_ * auVar101._20_4_;
          auVar55._24_4_ = auVar128._24_4_ * auVar101._24_4_;
          auVar55._28_4_ = 0;
          auVar56._4_4_ = auVar101._4_4_ * -auVar127._4_4_;
          auVar56._0_4_ = auVar101._0_4_ * -auVar127._0_4_;
          auVar56._8_4_ = auVar101._8_4_ * -auVar127._8_4_;
          auVar56._12_4_ = auVar101._12_4_ * -auVar127._12_4_;
          auVar56._16_4_ = auVar101._16_4_ * -auVar127._16_4_;
          auVar56._20_4_ = auVar101._20_4_ * -auVar127._20_4_;
          auVar56._24_4_ = auVar101._24_4_ * -auVar127._24_4_;
          auVar56._28_4_ = auVar128._28_4_;
          auVar113 = vmulps_avx512vl(auVar101,ZEXT1632(auVar97));
          auVar112 = ZEXT1632(auVar97);
          auVar101 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar112);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar130,auVar130);
          auVar105 = vrsqrt14ps_avx512vl(auVar101);
          auVar101 = vmulps_avx512vl(auVar101,auVar216);
          fVar165 = auVar105._0_4_;
          fVar148 = auVar105._4_4_;
          fVar161 = auVar105._8_4_;
          fVar162 = auVar105._12_4_;
          fVar172 = auVar105._16_4_;
          fVar186 = auVar105._20_4_;
          fVar88 = auVar105._24_4_;
          auVar57._4_4_ = fVar148 * fVar148 * fVar148 * auVar101._4_4_;
          auVar57._0_4_ = fVar165 * fVar165 * fVar165 * auVar101._0_4_;
          auVar57._8_4_ = fVar161 * fVar161 * fVar161 * auVar101._8_4_;
          auVar57._12_4_ = fVar162 * fVar162 * fVar162 * auVar101._12_4_;
          auVar57._16_4_ = fVar172 * fVar172 * fVar172 * auVar101._16_4_;
          auVar57._20_4_ = fVar186 * fVar186 * fVar186 * auVar101._20_4_;
          auVar57._24_4_ = fVar88 * fVar88 * fVar88 * auVar101._24_4_;
          auVar57._28_4_ = auVar101._28_4_;
          auVar101 = vfmadd231ps_avx512vl(auVar57,auVar114,auVar105);
          auVar58._4_4_ = auVar130._4_4_ * auVar101._4_4_;
          auVar58._0_4_ = auVar130._0_4_ * auVar101._0_4_;
          auVar58._8_4_ = auVar130._8_4_ * auVar101._8_4_;
          auVar58._12_4_ = auVar130._12_4_ * auVar101._12_4_;
          auVar58._16_4_ = auVar130._16_4_ * auVar101._16_4_;
          auVar58._20_4_ = auVar130._20_4_ * auVar101._20_4_;
          auVar58._24_4_ = auVar130._24_4_ * auVar101._24_4_;
          auVar58._28_4_ = auVar105._28_4_;
          auVar59._4_4_ = auVar101._4_4_ * auVar103._4_4_;
          auVar59._0_4_ = auVar101._0_4_ * auVar103._0_4_;
          auVar59._8_4_ = auVar101._8_4_ * auVar103._8_4_;
          auVar59._12_4_ = auVar101._12_4_ * auVar103._12_4_;
          auVar59._16_4_ = auVar101._16_4_ * auVar103._16_4_;
          auVar59._20_4_ = auVar101._20_4_ * auVar103._20_4_;
          auVar59._24_4_ = auVar101._24_4_ * auVar103._24_4_;
          auVar59._28_4_ = auVar103._28_4_;
          auVar103 = vmulps_avx512vl(auVar101,auVar112);
          auVar94 = vfmadd213ps_fma(auVar55,auVar100,ZEXT1632(auVar95));
          auVar152 = vfmadd213ps_fma(auVar56,auVar100,ZEXT1632(auVar96));
          auVar114 = vfmadd213ps_avx512vl(auVar113,auVar100,auVar102);
          auVar105 = vfmadd213ps_avx512vl(auVar58,auVar108,ZEXT1632(auVar150));
          auVar90 = vfnmadd213ps_fma(auVar55,auVar100,ZEXT1632(auVar95));
          auVar95 = vfmadd213ps_fma(auVar59,auVar108,ZEXT1632(auVar8));
          auVar202 = vfnmadd213ps_fma(auVar56,auVar100,ZEXT1632(auVar96));
          auVar96 = vfmadd213ps_fma(auVar103,auVar108,auVar104);
          auVar28 = vfnmadd231ps_fma(auVar102,auVar100,auVar113);
          auVar173 = vfnmadd213ps_fma(auVar58,auVar108,ZEXT1632(auVar150));
          auVar91 = vfnmadd213ps_fma(auVar59,auVar108,ZEXT1632(auVar8));
          auVar92 = vfnmadd231ps_fma(auVar104,auVar108,auVar103);
          auVar104 = vsubps_avx512vl(auVar105,ZEXT1632(auVar90));
          auVar103 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar202));
          auVar101 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar28));
          auVar60._4_4_ = auVar103._4_4_ * auVar28._4_4_;
          auVar60._0_4_ = auVar103._0_4_ * auVar28._0_4_;
          auVar60._8_4_ = auVar103._8_4_ * auVar28._8_4_;
          auVar60._12_4_ = auVar103._12_4_ * auVar28._12_4_;
          auVar60._16_4_ = auVar103._16_4_ * 0.0;
          auVar60._20_4_ = auVar103._20_4_ * 0.0;
          auVar60._24_4_ = auVar103._24_4_ * 0.0;
          auVar60._28_4_ = auVar113._28_4_;
          auVar150 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar202),auVar101);
          auVar61._4_4_ = auVar101._4_4_ * auVar90._4_4_;
          auVar61._0_4_ = auVar101._0_4_ * auVar90._0_4_;
          auVar61._8_4_ = auVar101._8_4_ * auVar90._8_4_;
          auVar61._12_4_ = auVar101._12_4_ * auVar90._12_4_;
          auVar61._16_4_ = auVar101._16_4_ * 0.0;
          auVar61._20_4_ = auVar101._20_4_ * 0.0;
          auVar61._24_4_ = auVar101._24_4_ * 0.0;
          auVar61._28_4_ = auVar101._28_4_;
          auVar8 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar28),auVar104);
          auVar62._4_4_ = auVar202._4_4_ * auVar104._4_4_;
          auVar62._0_4_ = auVar202._0_4_ * auVar104._0_4_;
          auVar62._8_4_ = auVar202._8_4_ * auVar104._8_4_;
          auVar62._12_4_ = auVar202._12_4_ * auVar104._12_4_;
          auVar62._16_4_ = auVar104._16_4_ * 0.0;
          auVar62._20_4_ = auVar104._20_4_ * 0.0;
          auVar62._24_4_ = auVar104._24_4_ * 0.0;
          auVar62._28_4_ = auVar104._28_4_;
          auVar93 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar90),auVar103);
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar112,ZEXT1632(auVar8));
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar112,ZEXT1632(auVar150));
          auVar98 = ZEXT1632(auVar97);
          uVar77 = vcmpps_avx512vl(auVar103,auVar98,2);
          bVar76 = (byte)uVar77;
          fVar140 = (float)((uint)(bVar76 & 1) * auVar94._0_4_ |
                           (uint)!(bool)(bVar76 & 1) * auVar173._0_4_);
          bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
          fVar142 = (float)((uint)bVar17 * auVar94._4_4_ | (uint)!bVar17 * auVar173._4_4_);
          bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
          fVar145 = (float)((uint)bVar17 * auVar94._8_4_ | (uint)!bVar17 * auVar173._8_4_);
          bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
          fVar146 = (float)((uint)bVar17 * auVar94._12_4_ | (uint)!bVar17 * auVar173._12_4_);
          auVar112 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar145,CONCAT44(fVar142,fVar140))));
          fVar141 = (float)((uint)(bVar76 & 1) * auVar152._0_4_ |
                           (uint)!(bool)(bVar76 & 1) * auVar91._0_4_);
          bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
          fVar144 = (float)((uint)bVar17 * auVar152._4_4_ | (uint)!bVar17 * auVar91._4_4_);
          bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
          fVar143 = (float)((uint)bVar17 * auVar152._8_4_ | (uint)!bVar17 * auVar91._8_4_);
          bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
          fVar147 = (float)((uint)bVar17 * auVar152._12_4_ | (uint)!bVar17 * auVar91._12_4_);
          auVar106 = ZEXT1632(CONCAT412(fVar147,CONCAT48(fVar143,CONCAT44(fVar144,fVar141))));
          auVar131._0_4_ =
               (float)((uint)(bVar76 & 1) * auVar114._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar92._0_4_);
          bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar131._4_4_ = (float)((uint)bVar17 * auVar114._4_4_ | (uint)!bVar17 * auVar92._4_4_);
          bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar131._8_4_ = (float)((uint)bVar17 * auVar114._8_4_ | (uint)!bVar17 * auVar92._8_4_);
          bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar131._12_4_ = (float)((uint)bVar17 * auVar114._12_4_ | (uint)!bVar17 * auVar92._12_4_)
          ;
          fVar165 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar114._16_4_);
          auVar131._16_4_ = fVar165;
          fVar148 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar114._20_4_);
          auVar131._20_4_ = fVar148;
          fVar161 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar114._24_4_);
          auVar131._24_4_ = fVar161;
          iVar1 = (uint)(byte)(uVar77 >> 7) * auVar114._28_4_;
          auVar131._28_4_ = iVar1;
          auVar103 = vblendmps_avx512vl(ZEXT1632(auVar90),auVar105);
          auVar132._0_4_ =
               (uint)(bVar76 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar150._0_4_;
          bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar132._4_4_ = (uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * auVar150._4_4_;
          bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar132._8_4_ = (uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * auVar150._8_4_;
          bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar132._12_4_ = (uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * auVar150._12_4_;
          auVar132._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * auVar103._16_4_;
          auVar132._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * auVar103._20_4_;
          auVar132._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * auVar103._24_4_;
          auVar132._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar103._28_4_;
          auVar103 = vblendmps_avx512vl(ZEXT1632(auVar202),ZEXT1632(auVar95));
          auVar133._0_4_ =
               (float)((uint)(bVar76 & 1) * auVar103._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar94._0_4_);
          bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar133._4_4_ = (float)((uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * auVar94._4_4_);
          bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar133._8_4_ = (float)((uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * auVar94._8_4_);
          bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar133._12_4_ = (float)((uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * auVar94._12_4_)
          ;
          fVar186 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar103._16_4_);
          auVar133._16_4_ = fVar186;
          fVar162 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar103._20_4_);
          auVar133._20_4_ = fVar162;
          fVar172 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar103._24_4_);
          auVar133._24_4_ = fVar172;
          auVar133._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar103._28_4_;
          auVar103 = vblendmps_avx512vl(ZEXT1632(auVar28),ZEXT1632(auVar96));
          auVar134._0_4_ =
               (float)((uint)(bVar76 & 1) * auVar103._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar152._0_4_);
          bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar134._4_4_ = (float)((uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * auVar152._4_4_);
          bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar134._8_4_ = (float)((uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * auVar152._8_4_);
          bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar134._12_4_ =
               (float)((uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * auVar152._12_4_);
          fVar89 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar103._16_4_);
          auVar134._16_4_ = fVar89;
          fVar88 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar103._20_4_);
          auVar134._20_4_ = fVar88;
          fVar171 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar103._24_4_);
          auVar134._24_4_ = fVar171;
          iVar2 = (uint)(byte)(uVar77 >> 7) * auVar103._28_4_;
          auVar134._28_4_ = iVar2;
          auVar135._0_4_ =
               (uint)(bVar76 & 1) * (int)auVar90._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar105._0_4_;
          bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar135._4_4_ = (uint)bVar17 * (int)auVar90._4_4_ | (uint)!bVar17 * auVar105._4_4_;
          bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar135._8_4_ = (uint)bVar17 * (int)auVar90._8_4_ | (uint)!bVar17 * auVar105._8_4_;
          bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar135._12_4_ = (uint)bVar17 * (int)auVar90._12_4_ | (uint)!bVar17 * auVar105._12_4_;
          auVar135._16_4_ = (uint)!(bool)((byte)(uVar77 >> 4) & 1) * auVar105._16_4_;
          auVar135._20_4_ = (uint)!(bool)((byte)(uVar77 >> 5) & 1) * auVar105._20_4_;
          auVar135._24_4_ = (uint)!(bool)((byte)(uVar77 >> 6) & 1) * auVar105._24_4_;
          auVar135._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar105._28_4_;
          bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar77 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar77 >> 3) & 1);
          bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar77 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar105 = vsubps_avx512vl(auVar135,auVar112);
          auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar202._12_4_ |
                                                   (uint)!bVar21 * auVar95._12_4_,
                                                   CONCAT48((uint)bVar19 * (int)auVar202._8_4_ |
                                                            (uint)!bVar19 * auVar95._8_4_,
                                                            CONCAT44((uint)bVar17 *
                                                                     (int)auVar202._4_4_ |
                                                                     (uint)!bVar17 * auVar95._4_4_,
                                                                     (uint)(bVar76 & 1) *
                                                                     (int)auVar202._0_4_ |
                                                                     (uint)!(bool)(bVar76 & 1) *
                                                                     auVar95._0_4_)))),auVar106);
          auVar197 = ZEXT3264(auVar101);
          auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar28._12_4_ |
                                                   (uint)!bVar22 * auVar96._12_4_,
                                                   CONCAT48((uint)bVar20 * (int)auVar28._8_4_ |
                                                            (uint)!bVar20 * auVar96._8_4_,
                                                            CONCAT44((uint)bVar18 *
                                                                     (int)auVar28._4_4_ |
                                                                     (uint)!bVar18 * auVar96._4_4_,
                                                                     (uint)(bVar76 & 1) *
                                                                     (int)auVar28._0_4_ |
                                                                     (uint)!(bool)(bVar76 & 1) *
                                                                     auVar96._0_4_)))),auVar131);
          auVar113 = vsubps_avx(auVar112,auVar132);
          auVar201 = ZEXT3264(auVar113);
          auVar104 = vsubps_avx(auVar106,auVar133);
          auVar102 = vsubps_avx(auVar131,auVar134);
          auVar63._4_4_ = auVar114._4_4_ * fVar142;
          auVar63._0_4_ = auVar114._0_4_ * fVar140;
          auVar63._8_4_ = auVar114._8_4_ * fVar145;
          auVar63._12_4_ = auVar114._12_4_ * fVar146;
          auVar63._16_4_ = auVar114._16_4_ * 0.0;
          auVar63._20_4_ = auVar114._20_4_ * 0.0;
          auVar63._24_4_ = auVar114._24_4_ * 0.0;
          auVar63._28_4_ = 0;
          auVar95 = vfmsub231ps_fma(auVar63,auVar131,auVar105);
          auVar184._0_4_ = fVar141 * auVar105._0_4_;
          auVar184._4_4_ = fVar144 * auVar105._4_4_;
          auVar184._8_4_ = fVar143 * auVar105._8_4_;
          auVar184._12_4_ = fVar147 * auVar105._12_4_;
          auVar184._16_4_ = auVar105._16_4_ * 0.0;
          auVar184._20_4_ = auVar105._20_4_ * 0.0;
          auVar184._24_4_ = auVar105._24_4_ * 0.0;
          auVar184._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar184,auVar112,auVar101);
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar98,ZEXT1632(auVar95));
          auVar190._0_4_ = auVar101._0_4_ * auVar131._0_4_;
          auVar190._4_4_ = auVar101._4_4_ * auVar131._4_4_;
          auVar190._8_4_ = auVar101._8_4_ * auVar131._8_4_;
          auVar190._12_4_ = auVar101._12_4_ * auVar131._12_4_;
          auVar190._16_4_ = auVar101._16_4_ * fVar165;
          auVar190._20_4_ = auVar101._20_4_ * fVar148;
          auVar190._24_4_ = auVar101._24_4_ * fVar161;
          auVar190._28_4_ = 0;
          auVar95 = vfmsub231ps_fma(auVar190,auVar106,auVar114);
          auVar107 = vfmadd231ps_avx512vl(auVar103,auVar98,ZEXT1632(auVar95));
          auVar103 = vmulps_avx512vl(auVar102,auVar132);
          auVar103 = vfmsub231ps_avx512vl(auVar103,auVar113,auVar134);
          auVar64._4_4_ = auVar104._4_4_ * auVar134._4_4_;
          auVar64._0_4_ = auVar104._0_4_ * auVar134._0_4_;
          auVar64._8_4_ = auVar104._8_4_ * auVar134._8_4_;
          auVar64._12_4_ = auVar104._12_4_ * auVar134._12_4_;
          auVar64._16_4_ = auVar104._16_4_ * fVar89;
          auVar64._20_4_ = auVar104._20_4_ * fVar88;
          auVar64._24_4_ = auVar104._24_4_ * fVar171;
          auVar64._28_4_ = iVar2;
          auVar95 = vfmsub231ps_fma(auVar64,auVar133,auVar102);
          auVar191._0_4_ = auVar133._0_4_ * auVar113._0_4_;
          auVar191._4_4_ = auVar133._4_4_ * auVar113._4_4_;
          auVar191._8_4_ = auVar133._8_4_ * auVar113._8_4_;
          auVar191._12_4_ = auVar133._12_4_ * auVar113._12_4_;
          auVar191._16_4_ = fVar186 * auVar113._16_4_;
          auVar191._20_4_ = fVar162 * auVar113._20_4_;
          auVar191._24_4_ = fVar172 * auVar113._24_4_;
          auVar191._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar191,auVar104,auVar132);
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar98,auVar103);
          auVar109 = vfmadd231ps_avx512vl(auVar103,auVar98,ZEXT1632(auVar95));
          auVar192 = ZEXT3264(auVar109);
          auVar103 = vmaxps_avx(auVar107,auVar109);
          uVar24 = vcmpps_avx512vl(auVar103,auVar98,2);
          bVar86 = bVar86 & (byte)uVar24;
          if (bVar86 != 0) {
            uVar149 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar217._4_4_ = uVar149;
            auVar217._0_4_ = uVar149;
            auVar217._8_4_ = uVar149;
            auVar217._12_4_ = uVar149;
            auVar217._16_4_ = uVar149;
            auVar217._20_4_ = uVar149;
            auVar217._24_4_ = uVar149;
            auVar217._28_4_ = uVar149;
            auVar218 = ZEXT3264(auVar217);
            auVar65._4_4_ = auVar102._4_4_ * auVar101._4_4_;
            auVar65._0_4_ = auVar102._0_4_ * auVar101._0_4_;
            auVar65._8_4_ = auVar102._8_4_ * auVar101._8_4_;
            auVar65._12_4_ = auVar102._12_4_ * auVar101._12_4_;
            auVar65._16_4_ = auVar102._16_4_ * auVar101._16_4_;
            auVar65._20_4_ = auVar102._20_4_ * auVar101._20_4_;
            auVar65._24_4_ = auVar102._24_4_ * auVar101._24_4_;
            auVar65._28_4_ = auVar103._28_4_;
            auVar8 = vfmsub231ps_fma(auVar65,auVar104,auVar114);
            auVar66._4_4_ = auVar114._4_4_ * auVar113._4_4_;
            auVar66._0_4_ = auVar114._0_4_ * auVar113._0_4_;
            auVar66._8_4_ = auVar114._8_4_ * auVar113._8_4_;
            auVar66._12_4_ = auVar114._12_4_ * auVar113._12_4_;
            auVar66._16_4_ = auVar114._16_4_ * auVar113._16_4_;
            auVar66._20_4_ = auVar114._20_4_ * auVar113._20_4_;
            auVar66._24_4_ = auVar114._24_4_ * auVar113._24_4_;
            auVar66._28_4_ = auVar114._28_4_;
            auVar150 = vfmsub231ps_fma(auVar66,auVar105,auVar102);
            auVar67._4_4_ = auVar104._4_4_ * auVar105._4_4_;
            auVar67._0_4_ = auVar104._0_4_ * auVar105._0_4_;
            auVar67._8_4_ = auVar104._8_4_ * auVar105._8_4_;
            auVar67._12_4_ = auVar104._12_4_ * auVar105._12_4_;
            auVar67._16_4_ = auVar104._16_4_ * auVar105._16_4_;
            auVar67._20_4_ = auVar104._20_4_ * auVar105._20_4_;
            auVar67._24_4_ = auVar104._24_4_ * auVar105._24_4_;
            auVar67._28_4_ = auVar104._28_4_;
            auVar94 = vfmsub231ps_fma(auVar67,auVar113,auVar101);
            auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar150),ZEXT1632(auVar94));
            auVar96 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT1632(auVar8),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar103 = vrcp14ps_avx512vl(ZEXT1632(auVar96));
            auVar201 = ZEXT3264(auVar103);
            auVar33._8_4_ = 0x3f800000;
            auVar33._0_8_ = 0x3f8000003f800000;
            auVar33._12_4_ = 0x3f800000;
            auVar33._16_4_ = 0x3f800000;
            auVar33._20_4_ = 0x3f800000;
            auVar33._24_4_ = 0x3f800000;
            auVar33._28_4_ = 0x3f800000;
            auVar101 = vfnmadd213ps_avx512vl(auVar103,ZEXT1632(auVar96),auVar33);
            auVar95 = vfmadd132ps_fma(auVar101,auVar103,auVar103);
            auVar197 = ZEXT1664(auVar95);
            auVar68._4_4_ = auVar94._4_4_ * auVar131._4_4_;
            auVar68._0_4_ = auVar94._0_4_ * auVar131._0_4_;
            auVar68._8_4_ = auVar94._8_4_ * auVar131._8_4_;
            auVar68._12_4_ = auVar94._12_4_ * auVar131._12_4_;
            auVar68._16_4_ = fVar165 * 0.0;
            auVar68._20_4_ = fVar148 * 0.0;
            auVar68._24_4_ = fVar161 * 0.0;
            auVar68._28_4_ = iVar1;
            auVar150 = vfmadd231ps_fma(auVar68,auVar106,ZEXT1632(auVar150));
            auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar112,ZEXT1632(auVar8));
            fVar165 = auVar95._0_4_;
            fVar148 = auVar95._4_4_;
            fVar161 = auVar95._8_4_;
            fVar162 = auVar95._12_4_;
            local_220 = ZEXT1632(CONCAT412(auVar150._12_4_ * fVar162,
                                           CONCAT48(auVar150._8_4_ * fVar161,
                                                    CONCAT44(auVar150._4_4_ * fVar148,
                                                             auVar150._0_4_ * fVar165))));
            auVar207 = ZEXT3264(local_220);
            uVar24 = vcmpps_avx512vl(local_220,auVar217,2);
            auVar75._4_4_ = uStack_41c;
            auVar75._0_4_ = local_420;
            auVar75._8_4_ = uStack_418;
            auVar75._12_4_ = uStack_414;
            auVar75._16_4_ = uStack_410;
            auVar75._20_4_ = uStack_40c;
            auVar75._24_4_ = uStack_408;
            auVar75._28_4_ = uStack_404;
            uVar25 = vcmpps_avx512vl(local_220,auVar75,0xd);
            bVar86 = (byte)uVar24 & (byte)uVar25 & bVar86;
            if (bVar86 != 0) {
              uVar81 = vcmpps_avx512vl(ZEXT1632(auVar96),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar81 = bVar86 & uVar81;
              if ((char)uVar81 != '\0') {
                fVar172 = auVar107._0_4_ * fVar165;
                fVar186 = auVar107._4_4_ * fVar148;
                auVar69._4_4_ = fVar186;
                auVar69._0_4_ = fVar172;
                fVar88 = auVar107._8_4_ * fVar161;
                auVar69._8_4_ = fVar88;
                fVar89 = auVar107._12_4_ * fVar162;
                auVar69._12_4_ = fVar89;
                fVar171 = auVar107._16_4_ * 0.0;
                auVar69._16_4_ = fVar171;
                fVar140 = auVar107._20_4_ * 0.0;
                auVar69._20_4_ = fVar140;
                fVar141 = auVar107._24_4_ * 0.0;
                auVar69._24_4_ = fVar141;
                auVar69._28_4_ = auVar107._28_4_;
                auVar170._8_4_ = 0x3f800000;
                auVar170._0_8_ = 0x3f8000003f800000;
                auVar170._12_4_ = 0x3f800000;
                auVar170._16_4_ = 0x3f800000;
                auVar170._20_4_ = 0x3f800000;
                auVar170._24_4_ = 0x3f800000;
                auVar170._28_4_ = 0x3f800000;
                auVar103 = vsubps_avx(auVar170,auVar69);
                local_260._0_4_ =
                     (float)((uint)(bVar76 & 1) * (int)fVar172 |
                            (uint)!(bool)(bVar76 & 1) * auVar103._0_4_);
                bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
                local_260._4_4_ =
                     (float)((uint)bVar17 * (int)fVar186 | (uint)!bVar17 * auVar103._4_4_);
                bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
                local_260._8_4_ =
                     (float)((uint)bVar17 * (int)fVar88 | (uint)!bVar17 * auVar103._8_4_);
                bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
                local_260._12_4_ =
                     (float)((uint)bVar17 * (int)fVar89 | (uint)!bVar17 * auVar103._12_4_);
                bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
                local_260._16_4_ =
                     (float)((uint)bVar17 * (int)fVar171 | (uint)!bVar17 * auVar103._16_4_);
                bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
                local_260._20_4_ =
                     (float)((uint)bVar17 * (int)fVar140 | (uint)!bVar17 * auVar103._20_4_);
                bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                local_260._24_4_ =
                     (float)((uint)bVar17 * (int)fVar141 | (uint)!bVar17 * auVar103._24_4_);
                bVar17 = SUB81(uVar77 >> 7,0);
                local_260._28_4_ =
                     (float)((uint)bVar17 * auVar107._28_4_ | (uint)!bVar17 * auVar103._28_4_);
                auVar103 = vsubps_avx(auVar108,auVar100);
                auVar95 = vfmadd213ps_fma(auVar103,local_260,auVar100);
                uVar149 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
                auVar34._4_4_ = uVar149;
                auVar34._0_4_ = uVar149;
                auVar34._8_4_ = uVar149;
                auVar34._12_4_ = uVar149;
                auVar34._16_4_ = uVar149;
                auVar34._20_4_ = uVar149;
                auVar34._24_4_ = uVar149;
                auVar34._28_4_ = uVar149;
                auVar103 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar95._12_4_ + auVar95._12_4_,
                                                              CONCAT48(auVar95._8_4_ + auVar95._8_4_
                                                                       ,CONCAT44(auVar95._4_4_ +
                                                                                 auVar95._4_4_,
                                                                                 auVar95._0_4_ +
                                                                                 auVar95._0_4_)))),
                                           auVar34);
                uVar87 = vcmpps_avx512vl(local_220,auVar103,6);
                uVar81 = uVar81 & uVar87;
                bVar86 = (byte)uVar81;
                if (bVar86 != 0) {
                  auVar164._0_4_ = auVar109._0_4_ * fVar165;
                  auVar164._4_4_ = auVar109._4_4_ * fVar148;
                  auVar164._8_4_ = auVar109._8_4_ * fVar161;
                  auVar164._12_4_ = auVar109._12_4_ * fVar162;
                  auVar164._16_4_ = auVar109._16_4_ * 0.0;
                  auVar164._20_4_ = auVar109._20_4_ * 0.0;
                  auVar164._24_4_ = auVar109._24_4_ * 0.0;
                  auVar164._28_4_ = 0;
                  auVar185._8_4_ = 0x3f800000;
                  auVar185._0_8_ = 0x3f8000003f800000;
                  auVar185._12_4_ = 0x3f800000;
                  auVar185._16_4_ = 0x3f800000;
                  auVar185._20_4_ = 0x3f800000;
                  auVar185._24_4_ = 0x3f800000;
                  auVar185._28_4_ = 0x3f800000;
                  auVar103 = vsubps_avx(auVar185,auVar164);
                  auVar136._0_4_ =
                       (uint)(bVar76 & 1) * (int)auVar164._0_4_ |
                       (uint)!(bool)(bVar76 & 1) * auVar103._0_4_;
                  bVar17 = (bool)((byte)(uVar77 >> 1) & 1);
                  auVar136._4_4_ =
                       (uint)bVar17 * (int)auVar164._4_4_ | (uint)!bVar17 * auVar103._4_4_;
                  bVar17 = (bool)((byte)(uVar77 >> 2) & 1);
                  auVar136._8_4_ =
                       (uint)bVar17 * (int)auVar164._8_4_ | (uint)!bVar17 * auVar103._8_4_;
                  bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
                  auVar136._12_4_ =
                       (uint)bVar17 * (int)auVar164._12_4_ | (uint)!bVar17 * auVar103._12_4_;
                  bVar17 = (bool)((byte)(uVar77 >> 4) & 1);
                  auVar136._16_4_ =
                       (uint)bVar17 * (int)auVar164._16_4_ | (uint)!bVar17 * auVar103._16_4_;
                  bVar17 = (bool)((byte)(uVar77 >> 5) & 1);
                  auVar136._20_4_ =
                       (uint)bVar17 * (int)auVar164._20_4_ | (uint)!bVar17 * auVar103._20_4_;
                  bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                  auVar136._24_4_ =
                       (uint)bVar17 * (int)auVar164._24_4_ | (uint)!bVar17 * auVar103._24_4_;
                  auVar136._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar103._28_4_;
                  auVar35._8_4_ = 0x40000000;
                  auVar35._0_8_ = 0x4000000040000000;
                  auVar35._12_4_ = 0x40000000;
                  auVar35._16_4_ = 0x40000000;
                  auVar35._20_4_ = 0x40000000;
                  auVar35._24_4_ = 0x40000000;
                  auVar35._28_4_ = 0x40000000;
                  local_240 = vfmsub132ps_avx512vl(auVar136,auVar185,auVar35);
                  local_200 = (int)lVar84;
                  local_1fc = iVar80;
                  auVar205 = ZEXT1664(local_5b0);
                  local_1f0 = local_5b0;
                  local_1e0 = uVar23;
                  uStack_1d8 = uVar26;
                  local_1d0 = uVar71;
                  uStack_1c8 = uVar72;
                  local_1c0 = uVar73;
                  uStack_1b8 = uVar74;
                  pGVar85 = (context->scene->geometries).items[uVar82].ptr;
                  if ((pGVar85->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar95 = vcvtsi2ss_avx512f(auVar97,(int)lVar84);
                    fVar165 = auVar95._0_4_;
                    local_1a0[0] = (fVar165 + local_260._0_4_ + 0.0) * (float)local_4c0;
                    local_1a0[1] = (fVar165 + local_260._4_4_ + 1.0) * local_4c0._4_4_;
                    local_1a0[2] = (fVar165 + local_260._8_4_ + 2.0) * fStack_4b8;
                    local_1a0[3] = (fVar165 + local_260._12_4_ + 3.0) * fStack_4b4;
                    fStack_190 = (fVar165 + local_260._16_4_ + 4.0) * fStack_4b0;
                    fStack_18c = (fVar165 + local_260._20_4_ + 5.0) * fStack_4ac;
                    fStack_188 = (fVar165 + local_260._24_4_ + 6.0) * fStack_4a8;
                    fStack_184 = fVar165 + local_260._28_4_ + 7.0;
                    local_180 = local_240;
                    local_160 = local_220;
                    auVar156._8_4_ = 0x7f800000;
                    auVar156._0_8_ = 0x7f8000007f800000;
                    auVar156._12_4_ = 0x7f800000;
                    auVar156._16_4_ = 0x7f800000;
                    auVar156._20_4_ = 0x7f800000;
                    auVar156._24_4_ = 0x7f800000;
                    auVar156._28_4_ = 0x7f800000;
                    auVar103 = vblendmps_avx512vl(auVar156,local_220);
                    auVar137._0_4_ =
                         (uint)(bVar86 & 1) * auVar103._0_4_ |
                         (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar81 >> 1) & 1);
                    auVar137._4_4_ = (uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar81 >> 2) & 1);
                    auVar137._8_4_ = (uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar81 >> 3) & 1);
                    auVar137._12_4_ = (uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar81 >> 4) & 1);
                    auVar137._16_4_ = (uint)bVar17 * auVar103._16_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar81 >> 5) & 1);
                    auVar137._20_4_ = (uint)bVar17 * auVar103._20_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar81 >> 6) & 1);
                    auVar137._24_4_ = (uint)bVar17 * auVar103._24_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = SUB81(uVar81 >> 7,0);
                    auVar137._28_4_ = (uint)bVar17 * auVar103._28_4_ | (uint)!bVar17 * 0x7f800000;
                    auVar103 = vshufps_avx(auVar137,auVar137,0xb1);
                    auVar103 = vminps_avx(auVar137,auVar103);
                    auVar101 = vshufpd_avx(auVar103,auVar103,5);
                    auVar103 = vminps_avx(auVar103,auVar101);
                    auVar101 = vpermpd_avx2(auVar103,0x4e);
                    auVar103 = vminps_avx(auVar103,auVar101);
                    uVar24 = vcmpps_avx512vl(auVar137,auVar103,0);
                    uVar78 = (uint)uVar81;
                    if (((byte)uVar24 & bVar86) != 0) {
                      uVar78 = (uint)((byte)uVar24 & bVar86);
                    }
                    uVar79 = 0;
                    for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
                      uVar79 = uVar79 + 1;
                    }
                    uVar77 = (ulong)uVar79;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar85->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_120 = vmovdqa64_avx512vl(auVar220._0_32_);
                      local_4e0._0_4_ = iVar80;
                      local_548 = uVar83;
                      local_460 = local_220;
                      do {
                        fVar165 = local_1a0[uVar77];
                        local_3c0._4_4_ = fVar165;
                        local_3c0._0_4_ = fVar165;
                        local_3c0._8_4_ = fVar165;
                        local_3c0._12_4_ = fVar165;
                        local_3b0 = *(undefined4 *)(local_180 + uVar77 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_160 + uVar77 * 4);
                        local_5a0.context = context->user;
                        fVar148 = 1.0 - fVar165;
                        auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar165 * (fVar148 + fVar148))),
                                                  ZEXT416((uint)fVar148),ZEXT416((uint)fVar148));
                        auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3c0,
                                                  ZEXT416(0xc0a00000));
                        auVar150 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165 * 3.0)),
                                                   ZEXT416((uint)(fVar165 + fVar165)),auVar95);
                        auVar201 = ZEXT1664(auVar150);
                        auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3c0,
                                                  ZEXT416(0x40000000));
                        auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148 * -3.0)),
                                                  ZEXT416((uint)(fVar148 + fVar148)),auVar95);
                        auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165)),local_3c0,
                                                  ZEXT416((uint)(fVar148 * -2.0)));
                        fVar165 = auVar8._0_4_ * 0.5;
                        fVar148 = auVar150._0_4_ * 0.5;
                        fVar161 = auVar95._0_4_ * 0.5;
                        fVar162 = auVar96._0_4_ * 0.5;
                        auVar179._0_4_ = fVar162 * local_5f0;
                        auVar179._4_4_ = fVar162 * fStack_5ec;
                        auVar179._8_4_ = fVar162 * fStack_5e8;
                        auVar179._12_4_ = fVar162 * fStack_5e4;
                        auVar195._4_4_ = fVar161;
                        auVar195._0_4_ = fVar161;
                        auVar195._8_4_ = fVar161;
                        auVar195._12_4_ = fVar161;
                        auVar95 = vfmadd132ps_fma(auVar195,auVar179,auVar11);
                        auVar197 = ZEXT1664(auVar95);
                        auVar180._4_4_ = fVar148;
                        auVar180._0_4_ = fVar148;
                        auVar180._8_4_ = fVar148;
                        auVar180._12_4_ = fVar148;
                        auVar96 = vfmadd132ps_fma(auVar180,auVar95,auVar12);
                        auVar151._4_4_ = fVar165;
                        auVar151._0_4_ = fVar165;
                        auVar151._8_4_ = fVar165;
                        auVar151._12_4_ = fVar165;
                        auVar96 = vfmadd213ps_fma(auVar151,auVar205._0_16_,auVar96);
                        local_3f0 = auVar96._0_4_;
                        local_3e0 = vshufps_avx(auVar96,auVar96,0x55);
                        auVar192 = ZEXT1664(local_3e0);
                        local_3d0 = vshufps_avx(auVar96,auVar96,0xaa);
                        iStack_3ec = local_3f0;
                        iStack_3e8 = local_3f0;
                        iStack_3e4 = local_3f0;
                        uStack_3ac = local_3b0;
                        uStack_3a8 = local_3b0;
                        uStack_3a4 = local_3b0;
                        local_3a0 = local_560._0_8_;
                        uStack_398 = local_560._8_8_;
                        local_390 = local_570;
                        vpcmpeqd_avx2(ZEXT1632(local_570),ZEXT1632(local_570));
                        uStack_37c = (local_5a0.context)->instID[0];
                        local_380 = uStack_37c;
                        uStack_378 = uStack_37c;
                        uStack_374 = uStack_37c;
                        uStack_370 = (local_5a0.context)->instPrimID[0];
                        uStack_36c = uStack_370;
                        uStack_368 = uStack_370;
                        uStack_364 = uStack_370;
                        local_5c0 = local_4f0;
                        local_5a0.valid = (int *)local_5c0;
                        local_5a0.geometryUserPtr = pGVar85->userPtr;
                        local_5a0.hit = (RTCHitN *)&local_3f0;
                        local_5a0.N = 4;
                        local_520 = auVar218._0_32_;
                        local_5a0.ray = (RTCRayN *)ray;
                        if (pGVar85->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar192 = ZEXT1664(local_3e0);
                          auVar197 = ZEXT1664(auVar95);
                          auVar201 = ZEXT1664(auVar150);
                          (*pGVar85->intersectionFilterN)(&local_5a0);
                          auVar207 = ZEXT3264(local_460);
                          auVar218 = ZEXT3264(local_520);
                          auVar205 = ZEXT1664(local_5b0);
                        }
                        uVar83 = vptestmd_avx512vl(local_5c0,local_5c0);
                        if ((uVar83 & 0xf) == 0) {
LAB_01d250c0:
                          *(int *)(ray + k * 4 + 0x80) = auVar218._0_4_;
                        }
                        else {
                          p_Var16 = context->args->filter;
                          if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar85->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar192 = ZEXT1664(auVar192._0_16_);
                            auVar197 = ZEXT1664(auVar197._0_16_);
                            auVar201 = ZEXT1664(auVar201._0_16_);
                            (*p_Var16)(&local_5a0);
                            auVar207 = ZEXT3264(local_460);
                            auVar218 = ZEXT3264(local_520);
                            auVar205 = ZEXT1664(local_5b0);
                          }
                          uVar83 = vptestmd_avx512vl(local_5c0,local_5c0);
                          uVar83 = uVar83 & 0xf;
                          bVar86 = (byte)uVar83;
                          if (bVar86 == 0) goto LAB_01d250c0;
                          iVar80 = *(int *)(local_5a0.hit + 4);
                          iVar1 = *(int *)(local_5a0.hit + 8);
                          iVar2 = *(int *)(local_5a0.hit + 0xc);
                          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar19 = SUB81(uVar83 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xc0) =
                               (uint)(bVar86 & 1) * *(int *)local_5a0.hit |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_5a0.ray + 0xc0);
                          *(uint *)(local_5a0.ray + 0xc4) =
                               (uint)bVar17 * iVar80 |
                               (uint)!bVar17 * *(int *)(local_5a0.ray + 0xc4);
                          *(uint *)(local_5a0.ray + 200) =
                               (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_5a0.ray + 200);
                          *(uint *)(local_5a0.ray + 0xcc) =
                               (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_5a0.ray + 0xcc)
                          ;
                          iVar80 = *(int *)(local_5a0.hit + 0x14);
                          iVar1 = *(int *)(local_5a0.hit + 0x18);
                          iVar2 = *(int *)(local_5a0.hit + 0x1c);
                          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar19 = SUB81(uVar83 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xd0) =
                               (uint)(bVar86 & 1) * *(int *)(local_5a0.hit + 0x10) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_5a0.ray + 0xd0);
                          *(uint *)(local_5a0.ray + 0xd4) =
                               (uint)bVar17 * iVar80 |
                               (uint)!bVar17 * *(int *)(local_5a0.ray + 0xd4);
                          *(uint *)(local_5a0.ray + 0xd8) =
                               (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_5a0.ray + 0xd8)
                          ;
                          *(uint *)(local_5a0.ray + 0xdc) =
                               (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_5a0.ray + 0xdc)
                          ;
                          iVar80 = *(int *)(local_5a0.hit + 0x24);
                          iVar1 = *(int *)(local_5a0.hit + 0x28);
                          iVar2 = *(int *)(local_5a0.hit + 0x2c);
                          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar19 = SUB81(uVar83 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xe0) =
                               (uint)(bVar86 & 1) * *(int *)(local_5a0.hit + 0x20) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_5a0.ray + 0xe0);
                          *(uint *)(local_5a0.ray + 0xe4) =
                               (uint)bVar17 * iVar80 |
                               (uint)!bVar17 * *(int *)(local_5a0.ray + 0xe4);
                          *(uint *)(local_5a0.ray + 0xe8) =
                               (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_5a0.ray + 0xe8)
                          ;
                          *(uint *)(local_5a0.ray + 0xec) =
                               (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_5a0.ray + 0xec)
                          ;
                          iVar80 = *(int *)(local_5a0.hit + 0x34);
                          iVar1 = *(int *)(local_5a0.hit + 0x38);
                          iVar2 = *(int *)(local_5a0.hit + 0x3c);
                          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar19 = SUB81(uVar83 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xf0) =
                               (uint)(bVar86 & 1) * *(int *)(local_5a0.hit + 0x30) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_5a0.ray + 0xf0);
                          *(uint *)(local_5a0.ray + 0xf4) =
                               (uint)bVar17 * iVar80 |
                               (uint)!bVar17 * *(int *)(local_5a0.ray + 0xf4);
                          *(uint *)(local_5a0.ray + 0xf8) =
                               (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_5a0.ray + 0xf8)
                          ;
                          *(uint *)(local_5a0.ray + 0xfc) =
                               (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_5a0.ray + 0xfc)
                          ;
                          iVar80 = *(int *)(local_5a0.hit + 0x44);
                          iVar1 = *(int *)(local_5a0.hit + 0x48);
                          iVar2 = *(int *)(local_5a0.hit + 0x4c);
                          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar19 = SUB81(uVar83 >> 3,0);
                          *(uint *)(local_5a0.ray + 0x100) =
                               (uint)(bVar86 & 1) * *(int *)(local_5a0.hit + 0x40) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_5a0.ray + 0x100);
                          *(uint *)(local_5a0.ray + 0x104) =
                               (uint)bVar17 * iVar80 |
                               (uint)!bVar17 * *(int *)(local_5a0.ray + 0x104);
                          *(uint *)(local_5a0.ray + 0x108) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_5a0.ray + 0x108);
                          *(uint *)(local_5a0.ray + 0x10c) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_5a0.ray + 0x10c);
                          auVar95 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x50))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x110) = auVar95;
                          auVar95 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x60))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x120) = auVar95;
                          auVar95 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x70))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x130) = auVar95;
                          auVar95 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x80))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x140) = auVar95;
                          auVar218 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                        }
                        bVar86 = ~(byte)(1 << ((uint)uVar77 & 0x1f)) & (byte)uVar81;
                        uVar149 = auVar218._0_4_;
                        auVar157._4_4_ = uVar149;
                        auVar157._0_4_ = uVar149;
                        auVar157._8_4_ = uVar149;
                        auVar157._12_4_ = uVar149;
                        auVar157._16_4_ = uVar149;
                        auVar157._20_4_ = uVar149;
                        auVar157._24_4_ = uVar149;
                        auVar157._28_4_ = uVar149;
                        uVar24 = vcmpps_avx512vl(auVar207._0_32_,auVar157,2);
                        if ((bVar86 & (byte)uVar24) == 0) goto LAB_01d25154;
                        bVar86 = bVar86 & (byte)uVar24;
                        uVar81 = (ulong)bVar86;
                        auVar158._8_4_ = 0x7f800000;
                        auVar158._0_8_ = 0x7f8000007f800000;
                        auVar158._12_4_ = 0x7f800000;
                        auVar158._16_4_ = 0x7f800000;
                        auVar158._20_4_ = 0x7f800000;
                        auVar158._24_4_ = 0x7f800000;
                        auVar158._28_4_ = 0x7f800000;
                        auVar103 = vblendmps_avx512vl(auVar158,auVar207._0_32_);
                        auVar138._0_4_ =
                             (uint)(bVar86 & 1) * auVar103._0_4_ |
                             (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                        bVar17 = (bool)(bVar86 >> 1 & 1);
                        auVar138._4_4_ = (uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar86 >> 2 & 1);
                        auVar138._8_4_ = (uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar86 >> 3 & 1);
                        auVar138._12_4_ =
                             (uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar86 >> 4 & 1);
                        auVar138._16_4_ =
                             (uint)bVar17 * auVar103._16_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar86 >> 5 & 1);
                        auVar138._20_4_ =
                             (uint)bVar17 * auVar103._20_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar86 >> 6 & 1);
                        auVar138._24_4_ =
                             (uint)bVar17 * auVar103._24_4_ | (uint)!bVar17 * 0x7f800000;
                        auVar138._28_4_ =
                             (uint)(bVar86 >> 7) * auVar103._28_4_ |
                             (uint)!(bool)(bVar86 >> 7) * 0x7f800000;
                        auVar103 = vshufps_avx(auVar138,auVar138,0xb1);
                        auVar103 = vminps_avx(auVar138,auVar103);
                        auVar101 = vshufpd_avx(auVar103,auVar103,5);
                        auVar103 = vminps_avx(auVar103,auVar101);
                        auVar101 = vpermpd_avx2(auVar103,0x4e);
                        auVar103 = vminps_avx(auVar103,auVar101);
                        uVar24 = vcmpps_avx512vl(auVar138,auVar103,0);
                        bVar76 = (byte)uVar24 & bVar86;
                        if (bVar76 != 0) {
                          bVar86 = bVar76;
                        }
                        uVar78 = 0;
                        for (uVar79 = (uint)bVar86; (uVar79 & 1) == 0;
                            uVar79 = uVar79 >> 1 | 0x80000000) {
                          uVar78 = uVar78 + 1;
                        }
                        uVar77 = (ulong)uVar78;
                      } while( true );
                    }
                    fVar165 = local_1a0[uVar77];
                    uVar149 = *(undefined4 *)(local_180 + uVar77 * 4);
                    fVar148 = 1.0 - fVar165;
                    auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar165 * (fVar148 + fVar148))),
                                              ZEXT416((uint)fVar148),ZEXT416((uint)fVar148));
                    auVar150 = ZEXT416((uint)fVar165);
                    auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar150,
                                              ZEXT416(0xc0a00000));
                    auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165 * 3.0)),
                                              ZEXT416((uint)(fVar165 + fVar165)),auVar95);
                    auVar201 = ZEXT1664(auVar96);
                    auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar150,
                                              ZEXT416(0x40000000));
                    auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148 * -3.0)),
                                              ZEXT416((uint)(fVar148 + fVar148)),auVar95);
                    auVar150 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165)),auVar150,
                                               ZEXT416((uint)(fVar148 * -2.0)));
                    fVar148 = auVar8._0_4_ * 0.5;
                    fVar161 = auVar96._0_4_ * 0.5;
                    auVar192 = ZEXT464((uint)fVar161);
                    fVar162 = auVar95._0_4_ * 0.5;
                    fVar172 = auVar150._0_4_ * 0.5;
                    auVar177._0_4_ = fVar172 * local_5f0;
                    auVar177._4_4_ = fVar172 * fStack_5ec;
                    auVar177._8_4_ = fVar172 * fStack_5e8;
                    auVar177._12_4_ = fVar172 * fStack_5e4;
                    auVar194._4_4_ = fVar162;
                    auVar194._0_4_ = fVar162;
                    auVar194._8_4_ = fVar162;
                    auVar194._12_4_ = fVar162;
                    auVar95 = vfmadd132ps_fma(auVar194,auVar177,auVar9);
                    auVar197 = ZEXT1664(auVar95);
                    auVar178._4_4_ = fVar161;
                    auVar178._0_4_ = fVar161;
                    auVar178._8_4_ = fVar161;
                    auVar178._12_4_ = fVar161;
                    auVar95 = vfmadd132ps_fma(auVar178,auVar95,auVar10);
                    auVar167._4_4_ = fVar148;
                    auVar167._0_4_ = fVar148;
                    auVar167._8_4_ = fVar148;
                    auVar167._12_4_ = fVar148;
                    auVar95 = vfmadd213ps_fma(auVar167,local_5b0,auVar95);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar77 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar95._0_4_;
                    uVar15 = vextractps_avx(auVar95,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar15;
                    uVar15 = vextractps_avx(auVar95,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar15;
                    *(float *)(ray + k * 4 + 0xf0) = fVar165;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar149;
                    *(uint *)(ray + k * 4 + 0x110) = uVar14;
                    *(uint *)(ray + k * 4 + 0x120) = uVar82;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01d24d5d;
      }
LAB_01d243b3:
      uVar149 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar32._4_4_ = uVar149;
      auVar32._0_4_ = uVar149;
      auVar32._8_4_ = uVar149;
      auVar32._12_4_ = uVar149;
      auVar32._16_4_ = uVar149;
      auVar32._20_4_ = uVar149;
      auVar32._24_4_ = uVar149;
      auVar32._28_4_ = uVar149;
      uVar23 = vcmpps_avx512vl(local_80,auVar32,2);
      uVar82 = (uint)uVar83 & (uint)uVar23;
      uVar83 = (ulong)uVar82;
    } while (uVar82 != 0);
  }
  return;
LAB_01d25154:
  auVar219 = ZEXT3264(local_480);
  auVar221 = ZEXT3264(local_4a0);
  auVar103 = vmovdqa64_avx512vl(local_120);
  auVar220 = ZEXT3264(auVar103);
  uVar83 = local_548;
  iVar80 = local_4e0._0_4_;
LAB_01d24d5d:
  lVar84 = lVar84 + 8;
  if (iVar80 <= (int)lVar84) goto LAB_01d243b3;
  goto LAB_01d24458;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }